

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::aggregateVars(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *row,int *i)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int32_t iVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  int iVar7;
  pointer pnVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  pointer pnVar10;
  undefined8 uVar11;
  pointer pnVar12;
  undefined8 uVar13;
  Tolerances *pTVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  Item *pIVar17;
  DataKey *pDVar18;
  int *piVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined5 uVar26;
  undefined5 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined4 uVar32;
  undefined8 uVar33;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  bool bVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  bool bVar52;
  undefined8 uVar53;
  bool bVar54;
  byte bVar55;
  int iVar56;
  int iVar57;
  double *pdVar58;
  AggregationPS *this_00;
  undefined8 *puVar59;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar60;
  long lVar61;
  long lVar62;
  int32_t *piVar63;
  int32_t *piVar64;
  undefined1 uVar65;
  long lVar66;
  cpp_dec_float<50U,_int,_void> *pcVar67;
  undefined1 uVar68;
  uint uVar69;
  fpclass_type fVar70;
  int32_t iVar71;
  Real RVar72;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  undefined1 local_e88 [28];
  bool local_e6c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e68;
  uint local_e54;
  fpclass_type local_e50;
  uint local_e4c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  undefined1 local_df8 [56];
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_dc0;
  double local_db8;
  undefined8 uStack_db0;
  undefined1 local_da8 [56];
  long local_d70;
  undefined1 local_d68 [64];
  undefined1 local_d28 [16];
  cpp_dec_float<50U,_int,_void> local_d18;
  long local_ce0;
  cpp_dec_float<50U,_int,_void> local_cd8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c98;
  undefined8 uStack_c90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  undefined1 local_c48 [48];
  undefined8 local_c18;
  undefined1 local_c08 [48];
  undefined8 local_bd8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  cpp_dec_float<50U,_int,_void> local_b88;
  cpp_dec_float<50U,_int,_void> local_b48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aggr_const;
  undefined1 local_ab8 [48];
  undefined8 local_a88;
  undefined1 local_a78 [48];
  undefined8 local_a48;
  int local_a38;
  int32_t iStack_a34;
  undefined8 uStack_a30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_45;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  obj_j;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_46;
  shared_ptr<soplex::Tolerances> local_968;
  fpclass_type local_958;
  int32_t iStack_954;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  uint local_928;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_49;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b8;
  undefined1 local_678 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_41;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b8;
  undefined1 local_578 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  undefined1 local_4f8 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  undefined1 local_478 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  undefined1 local_3f8 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b8;
  undefined1 local_378 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  undefined1 local_2f8 [64];
  cpp_dec_float<50U,_int,_void> local_2b8;
  cpp_dec_float<50U,_int,_void> local_280;
  cpp_dec_float<50U,_int,_void> local_248;
  cpp_dec_float<50U,_int,_void> local_210;
  cpp_dec_float<50U,_int,_void> local_1d8;
  cpp_dec_float<50U,_int,_void> local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  undefined1 local_128 [64];
  cpp_dec_float<50U,_int,_void> local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_35;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar56 = *i;
  pnVar8 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d68._32_8_ = *(undefined8 *)(pnVar8[iVar56].m_backend.data._M_elems + 8);
  local_d68._0_8_ = *(undefined8 *)&pnVar8[iVar56].m_backend.data;
  local_d68._8_8_ = *(undefined8 *)(pnVar8[iVar56].m_backend.data._M_elems + 2);
  puVar1 = pnVar8[iVar56].m_backend.data._M_elems + 4;
  local_d68._16_8_ = *(undefined8 *)puVar1;
  local_d68._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_d68._40_4_ = pnVar8[iVar56].m_backend.exp;
  local_d68[0x2c] = pnVar8[iVar56].m_backend.neg;
  local_d68._48_8_ = *(undefined8 *)&pnVar8[iVar56].m_backend.fpclass;
  pNVar9 = row->m_elem;
  local_e50 = pNVar9->idx;
  local_e54 = pNVar9[1].idx;
  local_df8._32_8_ = *(undefined8 *)((pNVar9->val).m_backend.data._M_elems + 8);
  local_df8._0_8_ = *(undefined8 *)(pNVar9->val).m_backend.data._M_elems;
  local_df8._8_8_ = *(undefined8 *)((pNVar9->val).m_backend.data._M_elems + 2);
  local_df8._16_8_ = *(undefined8 *)((pNVar9->val).m_backend.data._M_elems + 4);
  local_df8._24_8_ = *(undefined8 *)((pNVar9->val).m_backend.data._M_elems + 6);
  local_df8._40_4_ = (pNVar9->val).m_backend.exp;
  local_df8[0x2c] = (pNVar9->val).m_backend.neg;
  local_df8._48_8_ = *(undefined8 *)&(pNVar9->val).m_backend.fpclass;
  local_da8._32_8_ = *(undefined8 *)(pNVar9[1].val.m_backend.data._M_elems + 8);
  local_da8._0_8_ = *(undefined8 *)pNVar9[1].val.m_backend.data._M_elems;
  local_da8._8_8_ = *(undefined8 *)(pNVar9[1].val.m_backend.data._M_elems + 2);
  local_da8._16_8_ = *(undefined8 *)(pNVar9[1].val.m_backend.data._M_elems + 4);
  local_da8._24_8_ = *(undefined8 *)(pNVar9[1].val.m_backend.data._M_elems + 6);
  local_da8._40_4_ = pNVar9[1].val.m_backend.exp;
  local_da8[0x2c] = pNVar9[1].val.m_backend.neg;
  local_da8._48_8_ = *(undefined8 *)&pNVar9[1].val.m_backend.fpclass;
  local_d70 = (long)(int)local_e50;
  pnVar10 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).low.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = *(undefined8 *)(pnVar10[local_d70].m_backend.data._M_elems + 8);
  pnVar8 = pnVar10 + local_d70;
  local_b48.data._M_elems._0_8_ = *(undefined8 *)(pnVar8->m_backend).data._M_elems;
  local_b48.data._M_elems._8_8_ = *(undefined8 *)((pnVar8->m_backend).data._M_elems + 2);
  auVar24 = *(undefined1 (*) [16])&(pnVar8->m_backend).data;
  puVar1 = pnVar10[local_d70].m_backend.data._M_elems + 4;
  uVar20 = *(undefined8 *)puVar1;
  uVar21 = *(undefined8 *)(puVar1 + 2);
  local_e4c = pnVar10[local_d70].m_backend.exp;
  local_b48.neg = pnVar10[local_d70].m_backend.neg;
  local_c98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT71(local_c98._1_7_,local_b48.neg);
  fVar70 = pnVar10[local_d70].m_backend.fpclass;
  iVar4 = pnVar10[local_d70].m_backend.prec_elem;
  local_b48.prec_elem = iVar4;
  local_b48.fpclass = fVar70;
  pnVar12 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = *(undefined8 *)(pnVar12[local_d70].m_backend.data._M_elems + 8);
  pnVar8 = pnVar12 + local_d70;
  local_b88.data._M_elems._0_8_ = *(undefined8 *)(pnVar8->m_backend).data._M_elems;
  local_b88.data._M_elems._8_8_ = *(undefined8 *)((pnVar8->m_backend).data._M_elems + 2);
  auVar25 = *(undefined1 (*) [16])&(pnVar8->m_backend).data;
  puVar1 = pnVar12[local_d70].m_backend.data._M_elems + 4;
  uVar22 = *(undefined8 *)puVar1;
  uVar23 = *(undefined8 *)(puVar1 + 2);
  iVar56 = pnVar12[local_d70].m_backend.exp;
  bVar54 = pnVar12[local_d70].m_backend.neg;
  fVar5 = pnVar12[local_d70].m_backend.fpclass;
  iVar6 = pnVar12[local_d70].m_backend.prec_elem;
  local_b88.prec_elem = iVar6;
  local_b88.fpclass = fVar5;
  local_ce0 = (long)(int)local_e54;
  local_cd8.data._M_elems._32_8_ = *(undefined8 *)(pnVar10[local_ce0].m_backend.data._M_elems + 8);
  local_cd8.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[local_ce0].m_backend.data;
  local_cd8.data._M_elems._8_8_ = *(undefined8 *)(pnVar10[local_ce0].m_backend.data._M_elems + 2);
  puVar1 = pnVar10[local_ce0].m_backend.data._M_elems + 4;
  local_cd8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_cd8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_cd8.exp = pnVar10[local_ce0].m_backend.exp;
  _local_a38 = CONCAT44(iStack_a34,local_cd8.exp);
  uVar65 = pnVar10[local_ce0].m_backend.neg;
  local_cd8.fpclass = pnVar10[local_ce0].m_backend.fpclass;
  _local_958 = CONCAT44(iStack_954,local_cd8.fpclass);
  iVar71 = pnVar10[local_ce0].m_backend.prec_elem;
  local_cd8.prec_elem = iVar71;
  local_d18.data._M_elems._32_8_ = *(undefined8 *)(pnVar12[local_ce0].m_backend.data._M_elems + 8);
  local_d18.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[local_ce0].m_backend.data;
  local_d18.data._M_elems._8_8_ = *(undefined8 *)(pnVar12[local_ce0].m_backend.data._M_elems + 2);
  puVar1 = pnVar12[local_ce0].m_backend.data._M_elems + 4;
  local_d18.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_d18.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_d18.exp = pnVar12[local_ce0].m_backend.exp;
  uVar68 = pnVar12[local_ce0].m_backend.neg;
  local_d18.fpclass = pnVar12[local_ce0].m_backend.fpclass;
  uVar69 = pnVar12[local_ce0].m_backend.prec_elem;
  pnVar60 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(ulong)uVar69;
  local_d18.prec_elem = uVar69;
  local_dc0 = lp;
  local_d18.neg = (bool)uVar68;
  local_cd8.neg = (bool)uVar65;
  local_b88.data._M_elems._16_8_ = uVar22;
  local_b88.data._M_elems._24_8_ = uVar23;
  local_b88.data._M_elems._32_8_ = uVar13;
  local_b88.exp = iVar56;
  local_b88.neg = bVar54;
  local_b48.data._M_elems._16_8_ = uVar20;
  local_b48.data._M_elems._24_8_ = uVar21;
  local_b48.data._M_elems._32_8_ = uVar11;
  local_b48.exp = local_e4c;
  local_db8._0_4_ = local_d18.exp;
  local_d28._0_4_ = local_d18.fpclass;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1a0,this);
  local_a78._24_5_ = (undefined5)uVar21;
  local_a78._29_3_ = SUB83(uVar21,5);
  local_a78._40_4_ = local_e4c;
  local_a78[0x2c] = local_c98._0_1_;
  local_a48._4_4_ = iVar4;
  local_a48._0_4_ = fVar70;
  local_ab8._24_5_ = (undefined5)uVar23;
  local_ab8._29_3_ = SUB83(uVar23,5);
  local_a88._4_4_ = iVar6;
  local_a88._0_4_ = fVar5;
  local_ab8._0_16_ = auVar25;
  local_ab8._16_8_ = uVar22;
  local_ab8._32_8_ = uVar13;
  local_ab8._40_4_ = iVar56;
  local_ab8[0x2c] = bVar54;
  local_a78._0_16_ = auVar24;
  local_a78._16_8_ = uVar20;
  local_a78._32_8_ = uVar11;
  relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&result_2,(soplex *)local_a78,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_ab8,pnVar60);
  local_e88._16_4_ = result_2.m_backend.data._M_elems[8];
  local_e88._20_4_ =
       (undefined4)
       (CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,result_2.m_backend.data._M_elems._32_5_)
       >> 0x20);
  local_e88._0_4_ = result_2.m_backend.data._M_elems[4];
  local_e88._4_4_ = result_2.m_backend.data._M_elems[5];
  local_e88._8_4_ = result_2.m_backend.data._M_elems[6];
  local_e88._12_4_ =
       (undefined4)
       (CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,result_2.m_backend.data._M_elems._24_5_)
       >> 0x20);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = result_2.m_backend.data._M_elems[0];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = result_2.m_backend.data._M_elems[1];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = result_2.m_backend.data._M_elems[2];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = result_2.m_backend.data._M_elems[3];
  local_e88._24_4_ = result_2.m_backend.exp;
  local_e6c = result_2.m_backend.neg;
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_2.m_backend._48_8_;
  pnVar60 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(result_2.m_backend._48_8_ & 0xffffffff);
  if ((result_2.m_backend.neg == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || result_2.m_backend.fpclass != cpp_dec_float_finite)) {
    local_e6c = false;
  }
  if ((result_2.m_backend.fpclass == cpp_dec_float_NaN) || (local_1a0.fpclass == cpp_dec_float_NaN))
  {
    iVar56 = local_a38;
    fVar70 = local_958;
  }
  else {
    iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_1a0);
    if (iVar56 < 1) {
      return OKAY;
    }
    local_db8._0_4_ = local_d18.exp;
    local_d28._0_4_ = local_d18.fpclass;
    iVar56 = local_cd8.exp;
    uVar65 = local_cd8.neg;
    fVar70 = local_cd8.fpclass;
    iVar71 = local_cd8.prec_elem;
    uVar68 = local_d18.neg;
    uVar69 = local_d18.prec_elem;
  }
  uVar40 = local_cd8.data._M_elems._32_8_;
  uVar39 = local_cd8.data._M_elems._24_8_;
  uVar37 = local_cd8.data._M_elems._16_8_;
  uVar35 = local_cd8.data._M_elems._8_8_;
  uVar31 = local_cd8.data._M_elems._0_8_;
  uVar29 = local_d18.data._M_elems._32_8_;
  uVar28 = local_d18.data._M_elems._24_8_;
  uVar22 = local_d18.data._M_elems._16_8_;
  uVar20 = local_d18.data._M_elems._8_8_;
  uVar11 = local_d18.data._M_elems._0_8_;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1d8,this);
  uVar41 = local_cd8.data._M_elems._32_8_;
  uVar38 = local_cd8.data._M_elems._16_8_;
  uVar36 = local_cd8.data._M_elems._8_8_;
  uVar33 = local_cd8.data._M_elems._0_8_;
  uVar30 = local_d18.data._M_elems._32_8_;
  uVar23 = local_d18.data._M_elems._16_8_;
  uVar21 = local_d18.data._M_elems._8_8_;
  uVar13 = local_d18.data._M_elems._0_8_;
  local_cd8.data._M_elems[2] = (uint)uVar35;
  local_cd8.data._M_elems[3] = SUB84(uVar35,4);
  local_a78._8_4_ = local_cd8.data._M_elems[2];
  local_a78._12_4_ = local_cd8.data._M_elems[3];
  local_cd8.data._M_elems[0] = (uint)uVar31;
  local_cd8.data._M_elems[1] = SUB84(uVar31,4);
  local_a78._0_4_ = local_cd8.data._M_elems[0];
  local_a78._4_4_ = local_cd8.data._M_elems[1];
  local_cd8.data._M_elems[4] = (uint)uVar37;
  local_cd8.data._M_elems[5] = SUB84(uVar37,4);
  local_a78._16_4_ = local_cd8.data._M_elems[4];
  local_a78._20_4_ = local_cd8.data._M_elems[5];
  local_a78._24_5_ = (undefined5)uVar39;
  local_a78._29_3_ = SUB83(uVar39,5);
  local_cd8.data._M_elems[8] = (uint)uVar40;
  local_cd8.data._M_elems[9] = SUB84(uVar40,4);
  local_a78._32_4_ = local_cd8.data._M_elems[8];
  local_a78._36_4_ = local_cd8.data._M_elems[9];
  local_a48._4_4_ = iVar71;
  local_a48._0_4_ = fVar70;
  local_d18.data._M_elems[2] = (uint)uVar20;
  local_d18.data._M_elems[3] = SUB84(uVar20,4);
  local_ab8._8_4_ = local_d18.data._M_elems[2];
  local_ab8._12_4_ = local_d18.data._M_elems[3];
  local_d18.data._M_elems[0] = (uint)uVar11;
  local_d18.data._M_elems[1] = SUB84(uVar11,4);
  local_ab8._0_4_ = local_d18.data._M_elems[0];
  local_ab8._4_4_ = local_d18.data._M_elems[1];
  local_d18.data._M_elems[4] = (uint)uVar22;
  local_d18.data._M_elems[5] = SUB84(uVar22,4);
  local_ab8._16_4_ = local_d18.data._M_elems[4];
  local_ab8._20_4_ = local_d18.data._M_elems[5];
  local_ab8._24_5_ = (undefined5)uVar28;
  local_ab8._29_3_ = SUB83(uVar28,5);
  local_d18.data._M_elems[8] = (uint)uVar29;
  local_d18.data._M_elems[9] = SUB84(uVar29,4);
  local_ab8._32_4_ = local_d18.data._M_elems[8];
  local_ab8._36_4_ = local_d18.data._M_elems[9];
  local_ab8._40_4_ = local_db8._0_4_;
  local_a88._4_4_ = uVar69;
  local_a88._0_4_ = local_d28._0_4_;
  local_d18.data._M_elems._0_8_ = uVar13;
  local_d18.data._M_elems._8_8_ = uVar21;
  local_d18.data._M_elems._16_8_ = uVar23;
  local_d18.data._M_elems._32_8_ = uVar30;
  local_cd8.data._M_elems._0_8_ = uVar33;
  local_cd8.data._M_elems._8_8_ = uVar36;
  local_cd8.data._M_elems._16_8_ = uVar38;
  local_cd8.data._M_elems._32_8_ = uVar41;
  local_ab8[0x2c] = uVar68;
  local_a78._40_4_ = iVar56;
  local_a78[0x2c] = uVar65;
  relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&result_2,(soplex *)local_a78,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_ab8,pnVar60);
  local_e88._16_4_ = result_2.m_backend.data._M_elems[8];
  local_e88._20_4_ =
       (undefined4)
       (CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,result_2.m_backend.data._M_elems._32_5_)
       >> 0x20);
  local_e88._0_4_ = result_2.m_backend.data._M_elems[4];
  local_e88._4_4_ = result_2.m_backend.data._M_elems[5];
  local_e88._8_4_ = result_2.m_backend.data._M_elems[6];
  local_e88._12_4_ =
       (undefined4)
       (CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,result_2.m_backend.data._M_elems._24_5_)
       >> 0x20);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = result_2.m_backend.data._M_elems[0];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = result_2.m_backend.data._M_elems[1];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = result_2.m_backend.data._M_elems[2];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = result_2.m_backend.data._M_elems[3];
  local_e88._24_4_ = result_2.m_backend.exp;
  local_e6c = result_2.m_backend.neg;
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_2.m_backend._48_8_;
  if ((result_2.m_backend.neg == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || result_2.m_backend.fpclass != cpp_dec_float_finite)) {
    local_e6c = false;
  }
  if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) && (local_1d8.fpclass != cpp_dec_float_NaN)
      ) && (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_1d8), iVar56 < 1)) {
    return OKAY;
  }
  local_a48._0_4_ = cpp_dec_float_finite;
  local_a48._4_4_ = 10;
  local_a78._0_16_ = (undefined1  [16])0x0;
  local_a78._16_4_ = 0;
  local_a78._20_4_ = 0;
  local_a78._24_5_ = 0;
  local_a78._29_3_ = 0;
  local_a78._32_4_ = 0;
  local_a78._36_4_ = 0;
  local_a78._40_4_ = 0;
  local_a78[0x2c] = false;
  local_a88._0_4_ = cpp_dec_float_finite;
  local_a88._4_4_ = 10;
  local_ab8._0_16_ = (undefined1  [16])0x0;
  local_ab8._16_4_ = 0;
  local_ab8._20_4_ = 0;
  local_ab8._24_5_ = 0;
  local_ab8._29_3_ = 0;
  local_ab8._32_4_ = 0;
  local_ab8._36_4_ = 0;
  local_ab8._40_4_ = 0;
  local_ab8[0x2c] = false;
  local_bd8._0_4_ = cpp_dec_float_finite;
  local_bd8._4_4_ = 10;
  local_c08._0_16_ = (undefined1  [16])0x0;
  local_c08._16_4_ = 0;
  local_c08._20_4_ = 0;
  local_c08._24_5_ = 0;
  local_c08._29_3_ = 0;
  local_c08._32_4_ = 0;
  local_c08._36_4_ = 0;
  local_c08._40_4_ = 0;
  local_c08[0x2c] = false;
  local_c18._0_4_ = cpp_dec_float_finite;
  local_c18._4_4_ = 10;
  local_c48._0_16_ = (undefined1  [16])0x0;
  local_c48._16_4_ = 0;
  local_c48._20_4_ = 0;
  local_c48._24_5_ = 0;
  local_c48._29_3_ = 0;
  local_c48._32_4_ = 0;
  local_c48._36_4_ = 0;
  local_c48._40_4_ = 0;
  local_c48[0x2c] = false;
  result_2.m_backend.data._M_elems._32_5_ = SUB85(local_df8._32_8_,0);
  result_2.m_backend.data._M_elems[9]._1_3_ = SUB83(local_df8._32_8_,5);
  result_2.m_backend.data._M_elems[4] = local_df8._16_4_;
  result_2.m_backend.data._M_elems[5] = local_df8._20_4_;
  result_2.m_backend.data._M_elems._24_5_ = SUB85(local_df8._24_8_,0);
  result_2.m_backend.data._M_elems[7]._1_3_ = SUB83(local_df8._24_8_,5);
  result_2.m_backend.data._M_elems[0] = local_df8._0_4_;
  result_2.m_backend.data._M_elems[1] = local_df8._4_4_;
  result_2.m_backend.data._M_elems[2] = local_df8._8_4_;
  result_2.m_backend.data._M_elems[3] = local_df8._12_4_;
  result_2.m_backend.exp = local_df8._40_4_;
  result_2.m_backend.neg = local_df8[0x2c];
  result_2.m_backend.fpclass = local_df8._48_4_;
  result_2.m_backend.prec_elem = local_df8._52_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)local_da8);
  if (result_2.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00319cfa:
    result_2.m_backend.data._M_elems._32_5_ = SUB85(local_df8._32_8_,0);
    result_2.m_backend.data._M_elems[9]._1_3_ = SUB83(local_df8._32_8_,5);
    result_2.m_backend.data._M_elems[4] = local_df8._16_4_;
    result_2.m_backend.data._M_elems[5] = local_df8._20_4_;
    result_2.m_backend.data._M_elems._24_5_ = SUB85(local_df8._24_8_,0);
    result_2.m_backend.data._M_elems[7]._1_3_ = SUB83(local_df8._24_8_,5);
    result_2.m_backend.data._M_elems[2] = local_df8._8_4_;
    result_2.m_backend.data._M_elems[3] = local_df8._12_4_;
    result_2.m_backend.data._M_elems[0] = local_df8._0_4_;
    result_2.m_backend.data._M_elems[1] = local_df8._4_4_;
    result_2.m_backend.exp = local_df8._40_4_;
    result_2.m_backend.neg = local_df8[0x2c];
    result_2.m_backend.fpclass = local_df8._48_4_;
    result_2.m_backend.prec_elem = local_df8._52_4_;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)local_da8);
    if (result_2.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0031d608:
      puVar59 = (undefined8 *)__cxa_allocate_exception(0x28);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_e88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ptr,"XMAISM12 This should never happen.","");
      *puVar59 = &PTR__SPxException_003adbd8;
      puVar59[1] = puVar59 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar59 + 1),
                 ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(long)&(ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_PostStep +
                         CONCAT44(ptr.
                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_,
                                  (uint)ptr.
                                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi));
      *puVar59 = &PTR__SPxException_003ae9a0;
      __cxa_throw(puVar59,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e88._0_4_ = 0;
    local_e88._4_4_ = 0;
    local_e88._8_4_ = 0;
    local_e88._12_4_ = 0;
    local_e88._16_4_ = 0;
    local_e88._20_4_ = 0;
    local_e88._24_4_ = 0;
    local_e6c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,0.0);
    iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    if (iVar56 < 1) goto LAB_0031d608;
    ::soplex::infinity::__tls_init();
    pdVar58 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_db8 = *pdVar58;
    uStack_db0 = 0;
    local_d28._0_8_ = -local_db8;
    local_d28._8_4_ = 0;
    local_d28._12_4_ = 0x80000000;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT416(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
    if (((local_cd8.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_cd8,&result_2.m_backend), 0 < iVar56)) {
      obj_j.m_backend.data._M_elems[8] = local_da8._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_da8._36_4_;
      obj_j.m_backend.data._M_elems[4] = local_da8._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_da8._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_da8._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_da8._28_4_;
      obj_j.m_backend.data._M_elems[0] = local_da8._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_da8._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_da8._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_da8._12_4_;
      obj_j.m_backend.exp = local_da8._40_4_;
      obj_j.m_backend.neg = local_da8[0x2c];
      obj_j.m_backend.fpclass = local_da8._48_4_;
      obj_j.m_backend.prec_elem = local_da8._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_cd8);
      aggr_const.m_backend.data._M_elems[0] = local_d68._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d68._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d68._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d68._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d68._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d68._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d68._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d68._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d68._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d68._32_8_,5);
      aggr_const.m_backend.exp = local_d68._40_4_;
      aggr_const.m_backend.neg = local_d68[0x2c];
      aggr_const.m_backend.fpclass = local_d68._48_4_;
      aggr_const.m_backend.prec_elem = local_d68._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_df8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,(double)local_d28._0_8_);
    }
    local_a78._36_4_ = local_e88._20_4_;
    local_a78._32_4_ = local_e88._16_4_;
    local_a78._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_a78._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_a78._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_a78._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_a78._20_4_ = local_e88._4_4_;
    local_a78._16_4_ = local_e88._0_4_;
    local_a78._24_5_ = (undefined5)CONCAT44(local_e88._12_4_,local_e88._8_4_);
    local_a78._29_3_ = SUB43(local_e88._12_4_,1);
    local_a78._40_4_ = local_e88._24_4_;
    local_a78[0x2c] = local_e6c;
    local_a48 = local_e68._M_pi;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,local_db8);
    if (((local_d18.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_d18,&result_2.m_backend), iVar56 < 0)) {
      obj_j.m_backend.data._M_elems[8] = local_da8._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_da8._36_4_;
      obj_j.m_backend.data._M_elems[4] = local_da8._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_da8._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_da8._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_da8._28_4_;
      obj_j.m_backend.data._M_elems[0] = local_da8._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_da8._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_da8._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_da8._12_4_;
      obj_j.m_backend.exp = local_da8._40_4_;
      obj_j.m_backend.neg = local_da8[0x2c];
      obj_j.m_backend.fpclass = local_da8._48_4_;
      obj_j.m_backend.prec_elem = local_da8._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_d18);
      aggr_const.m_backend.data._M_elems[0] = local_d68._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d68._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d68._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d68._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d68._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d68._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d68._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d68._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d68._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d68._32_8_,5);
      aggr_const.m_backend.exp = local_d68._40_4_;
      aggr_const.m_backend.neg = local_d68[0x2c];
      aggr_const.m_backend.fpclass = local_d68._48_4_;
      aggr_const.m_backend.prec_elem = local_d68._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_df8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,local_db8);
    }
    local_ab8._36_4_ = local_e88._20_4_;
    local_ab8._32_4_ = local_e88._16_4_;
    local_ab8._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_ab8._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_ab8._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_ab8._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_ab8._20_4_ = local_e88._4_4_;
    local_ab8._16_4_ = local_e88._0_4_;
    local_ab8._24_5_ = (undefined5)CONCAT44(local_e88._12_4_,local_e88._8_4_);
    local_ab8._29_3_ = SUB43(local_e88._12_4_,1);
    local_ab8._40_4_ = local_e88._24_4_;
    local_ab8[0x2c] = local_e6c;
    local_a88 = local_e68._M_pi;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
    if (((local_b48.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b48,&result_2.m_backend), 0 < iVar56)) {
      obj_j.m_backend.data._M_elems[8] = local_df8._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_df8._36_4_;
      obj_j.m_backend.data._M_elems[4] = local_df8._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_df8._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_df8._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_df8._28_4_;
      obj_j.m_backend.data._M_elems[0] = local_df8._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_df8._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_df8._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_df8._12_4_;
      obj_j.m_backend.exp = local_df8._40_4_;
      obj_j.m_backend.neg = local_df8[0x2c];
      obj_j.m_backend.fpclass = local_df8._48_4_;
      obj_j.m_backend.prec_elem = local_df8._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_b48);
      aggr_const.m_backend.data._M_elems[0] = local_d68._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d68._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d68._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d68._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d68._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d68._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d68._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d68._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d68._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d68._32_8_,5);
      aggr_const.m_backend.exp = local_d68._40_4_;
      aggr_const.m_backend.neg = local_d68[0x2c];
      aggr_const.m_backend.fpclass = local_d68._48_4_;
      aggr_const.m_backend.prec_elem = local_d68._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_da8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,(double)local_d28._0_8_);
    }
    local_c08._36_4_ = local_e88._20_4_;
    local_c08._32_4_ = local_e88._16_4_;
    local_c08._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_c08._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_c08._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_c08._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_c08._20_4_ = local_e88._4_4_;
    local_c08._16_4_ = local_e88._0_4_;
    local_c08._24_5_ = (undefined5)CONCAT44(local_e88._12_4_,local_e88._8_4_);
    local_c08._29_3_ = SUB43(local_e88._12_4_,1);
    local_c08._40_4_ = local_e88._24_4_;
    local_c08[0x2c] = local_e6c;
    local_bd8 = local_e68._M_pi;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,local_db8);
    if (((local_b88.fpclass != cpp_dec_float_NaN) &&
        (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b88,&result_2.m_backend), -1 < iVar56)) goto LAB_0031a2f2;
    pcVar67 = &local_b88;
LAB_0031a9cf:
    obj_j.m_backend.data._M_elems._0_8_ = local_df8._0_8_;
    obj_j.m_backend.data._M_elems._8_8_ = local_df8._8_8_;
    obj_j.m_backend.data._M_elems._16_8_ = local_df8._16_8_;
    obj_j.m_backend.data._M_elems._24_8_ = local_df8._24_8_;
    obj_j.m_backend.data._M_elems._32_8_ = local_df8._32_8_;
    obj_j.m_backend.exp = local_df8._40_4_;
    obj_j.m_backend.neg = local_df8[0x2c];
    obj_j.m_backend._48_8_ = local_df8._48_8_;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&obj_j.m_backend,pcVar67);
    aggr_const.m_backend.data._M_elems[0] = local_d68._0_4_;
    aggr_const.m_backend.data._M_elems[1] = local_d68._4_4_;
    aggr_const.m_backend.data._M_elems[2] = local_d68._8_4_;
    aggr_const.m_backend.data._M_elems[3] = local_d68._12_4_;
    aggr_const.m_backend.data._M_elems[4] = local_d68._16_4_;
    aggr_const.m_backend.data._M_elems[5] = local_d68._20_4_;
    aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d68._24_8_,0);
    aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d68._24_8_,5);
    aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d68._32_8_,0);
    aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d68._32_8_,5);
    aggr_const.m_backend.exp = local_d68._40_4_;
    aggr_const.m_backend.neg = local_d68[0x2c];
    aggr_const.m_backend.fpclass = local_d68._48_4_;
    aggr_const.m_backend.prec_elem = local_d68._52_4_;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&aggr_const.m_backend,&obj_j.m_backend);
    local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e88._0_4_ = 0;
    local_e88._4_4_ = 0;
    local_e88._8_4_ = 0;
    local_e88._12_4_ = 0;
    local_e88._16_4_ = 0;
    local_e88._20_4_ = 0;
    local_e88._24_4_ = 0;
    local_e6c = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
               (cpp_dec_float<50U,_int,_void> *)local_da8);
  }
  else {
    local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e88._0_4_ = 0;
    local_e88._4_4_ = 0;
    local_e88._8_4_ = 0;
    local_e88._12_4_ = 0;
    local_e88._16_4_ = 0;
    local_e88._20_4_ = 0;
    local_e88._24_4_ = 0;
    local_e6c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,0.0);
    iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    if (-1 < iVar56) goto LAB_00319cfa;
    ::soplex::infinity::__tls_init();
    pdVar58 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_db8 = *pdVar58;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    uStack_db0 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,local_db8);
    if (((local_d18.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_d18,&result_2.m_backend), iVar56 < 0)) {
      obj_j.m_backend.data._M_elems[8] = local_da8._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_da8._36_4_;
      obj_j.m_backend.data._M_elems[4] = local_da8._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_da8._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_da8._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_da8._28_4_;
      obj_j.m_backend.data._M_elems[0] = local_da8._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_da8._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_da8._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_da8._12_4_;
      obj_j.m_backend.exp = local_da8._40_4_;
      obj_j.m_backend.neg = local_da8[0x2c];
      obj_j.m_backend.fpclass = local_da8._48_4_;
      obj_j.m_backend.prec_elem = local_da8._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_d18);
      aggr_const.m_backend.data._M_elems[0] = local_d68._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d68._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d68._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d68._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d68._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d68._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d68._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d68._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d68._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d68._32_8_,5);
      aggr_const.m_backend.exp = local_d68._40_4_;
      aggr_const.m_backend.neg = local_d68[0x2c];
      aggr_const.m_backend.fpclass = local_d68._48_4_;
      aggr_const.m_backend.prec_elem = local_d68._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_df8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,-local_db8);
    }
    local_a78._36_4_ = local_e88._20_4_;
    local_a78._32_4_ = local_e88._16_4_;
    local_a78._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_a78._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_a78._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_a78._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_a78._20_4_ = local_e88._4_4_;
    local_a78._16_4_ = local_e88._0_4_;
    local_a78._24_5_ = (undefined5)CONCAT44(local_e88._12_4_,local_e88._8_4_);
    local_a78._29_3_ = SUB43(local_e88._12_4_,1);
    local_a78._40_4_ = local_e88._24_4_;
    local_a78[0x2c] = local_e6c;
    local_a48 = local_e68._M_pi;
    ::soplex::infinity::__tls_init();
    local_d28._0_8_ = -local_db8;
    local_d28._8_4_ = (undefined4)uStack_db0;
    local_d28._12_4_ = uStack_db0._4_4_ ^ 0x80000000;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
    if (((local_cd8.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_cd8,&result_2.m_backend), 0 < iVar56)) {
      obj_j.m_backend.data._M_elems[8] = local_da8._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_da8._36_4_;
      obj_j.m_backend.data._M_elems[4] = local_da8._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_da8._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_da8._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_da8._28_4_;
      obj_j.m_backend.data._M_elems[0] = local_da8._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_da8._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_da8._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_da8._12_4_;
      obj_j.m_backend.exp = local_da8._40_4_;
      obj_j.m_backend.neg = local_da8[0x2c];
      obj_j.m_backend.fpclass = local_da8._48_4_;
      obj_j.m_backend.prec_elem = local_da8._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_cd8);
      aggr_const.m_backend.data._M_elems[0] = local_d68._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d68._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d68._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d68._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d68._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d68._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d68._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d68._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d68._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d68._32_8_,5);
      aggr_const.m_backend.exp = local_d68._40_4_;
      aggr_const.m_backend.neg = local_d68[0x2c];
      aggr_const.m_backend.fpclass = local_d68._48_4_;
      aggr_const.m_backend.prec_elem = local_d68._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_df8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,local_db8);
    }
    local_ab8._36_4_ = local_e88._20_4_;
    local_ab8._32_4_ = local_e88._16_4_;
    local_ab8._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_ab8._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_ab8._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_ab8._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_ab8._20_4_ = local_e88._4_4_;
    local_ab8._16_4_ = local_e88._0_4_;
    local_ab8._24_5_ = (undefined5)CONCAT44(local_e88._12_4_,local_e88._8_4_);
    local_ab8._29_3_ = SUB43(local_e88._12_4_,1);
    local_ab8._40_4_ = local_e88._24_4_;
    local_ab8[0x2c] = local_e6c;
    local_a88 = local_e68._M_pi;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,local_db8);
    if (((local_b88.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b88,&result_2.m_backend), iVar56 < 0)) {
      obj_j.m_backend.data._M_elems[8] = local_df8._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_df8._36_4_;
      obj_j.m_backend.data._M_elems[4] = local_df8._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_df8._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_df8._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_df8._28_4_;
      obj_j.m_backend.data._M_elems[0] = local_df8._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_df8._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_df8._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_df8._12_4_;
      obj_j.m_backend.exp = local_df8._40_4_;
      obj_j.m_backend.neg = local_df8[0x2c];
      obj_j.m_backend.fpclass = local_df8._48_4_;
      obj_j.m_backend.prec_elem = local_df8._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_b88);
      aggr_const.m_backend.data._M_elems[0] = local_d68._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d68._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d68._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d68._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d68._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d68._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d68._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d68._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d68._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d68._32_8_,5);
      aggr_const.m_backend.exp = local_d68._40_4_;
      aggr_const.m_backend.neg = local_d68[0x2c];
      aggr_const.m_backend.fpclass = local_d68._48_4_;
      aggr_const.m_backend.prec_elem = local_d68._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_da8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,(double)local_d28._0_8_);
    }
    local_c08._36_4_ = local_e88._20_4_;
    local_c08._32_4_ = local_e88._16_4_;
    local_c08._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_c08._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_c08._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_c08._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_c08._20_4_ = local_e88._4_4_;
    local_c08._16_4_ = local_e88._0_4_;
    local_c08._24_5_ = (undefined5)CONCAT44(local_e88._12_4_,local_e88._8_4_);
    local_c08._29_3_ = SUB43(local_e88._12_4_,1);
    local_c08._40_4_ = local_e88._24_4_;
    local_c08[0x2c] = local_e6c;
    local_bd8 = local_e68._M_pi;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
    if (((local_b48.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b48,&result_2.m_backend), 0 < iVar56)) {
      pcVar67 = &local_b48;
      goto LAB_0031a9cf;
    }
LAB_0031a2f2:
    ::soplex::infinity::__tls_init();
    local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e88._0_4_ = 0;
    local_e88._4_4_ = 0;
    local_e88._8_4_ = 0;
    local_e88._12_4_ = 0;
    local_e88._16_4_ = 0;
    local_e88._20_4_ = 0;
    local_e88._24_4_ = 0;
    local_e6c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,local_db8);
  }
  pSVar34 = local_dc0;
  local_c48._36_4_ = local_e88._20_4_;
  local_c48._32_4_ = local_e88._16_4_;
  local_c48._4_4_ =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr._4_4_;
  local_c48._0_4_ =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_c48._12_4_ =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_4_;
  local_c48._8_4_ =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  local_c48._20_4_ = local_e88._4_4_;
  local_c48._16_4_ = local_e88._0_4_;
  local_c48._24_5_ = (undefined5)CONCAT44(local_e88._12_4_,local_e88._8_4_);
  local_c48._29_3_ = SUB43(local_e88._12_4_,1);
  local_c48._40_4_ = local_e88._24_4_;
  local_c48[0x2c] = local_e6c;
  local_c18 = local_e68._M_pi;
  ::soplex::infinity::__tls_init();
  pdVar58 = (double *)__tls_get_addr(&PTR_003b4b70);
  local_d28._8_8_ = 0;
  local_d28._0_8_ = *pdVar58;
  local_db8 = -*pdVar58;
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  local_e88._0_4_ = 0;
  local_e88._4_4_ = 0;
  local_e88._8_4_ = 0;
  local_e88._12_4_ = 0;
  local_e88._16_4_ = 0;
  local_e88._20_4_ = 0;
  local_e88._24_4_ = 0;
  local_e6c = false;
  uStack_db0 = 0x8000000000000000;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&ptr,local_db8);
  if ((((fpclass_type)local_a48 == cpp_dec_float_NaN) ||
      ((fpclass_type)local_e68._M_pi == cpp_dec_float_NaN)) ||
     (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_a78,
                          (cpp_dec_float<50U,_int,_void> *)&ptr), 0 < iVar56)) {
LAB_0031ab36:
    ::soplex::infinity::__tls_init();
    local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e88._0_4_ = 0;
    local_e88._4_4_ = 0;
    local_e88._8_4_ = 0;
    local_e88._12_4_ = 0;
    local_e88._16_4_ = 0;
    local_e88._20_4_ = 0;
    local_e88._24_4_ = 0;
    local_e6c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,local_db8);
    if ((((fpclass_type)local_bd8 == cpp_dec_float_NaN) ||
        ((fpclass_type)local_e68._M_pi == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_c08,
                            (cpp_dec_float<50U,_int,_void> *)&ptr), 0 < iVar56)) {
LAB_0031ab99:
      local_2f8._32_8_ = local_a78._32_8_;
      local_2f8._29_3_ = local_a78._29_3_;
      local_2f8._24_5_ = local_a78._24_5_;
      local_2f8._16_8_ = local_a78._16_8_;
      local_2f8._0_8_ = local_a78._0_8_;
      local_2f8._8_8_ = local_a78._8_8_;
      local_2f8._40_4_ = local_a78._40_4_;
      local_2f8[0x2c] = (bool)local_a78[0x2c];
      local_2f8._48_8_ = local_a48;
      local_338.m_backend.data._M_elems[0] = local_b48.data._M_elems[0];
      local_338.m_backend.data._M_elems[1] = local_b48.data._M_elems[1];
      local_338.m_backend.data._M_elems[2] = local_b48.data._M_elems[2];
      local_338.m_backend.data._M_elems[3] = local_b48.data._M_elems[3];
      local_338.m_backend.data._M_elems[4] = local_b48.data._M_elems[4];
      local_338.m_backend.data._M_elems[5] = local_b48.data._M_elems[5];
      local_338.m_backend.data._M_elems[6] = local_b48.data._M_elems[6];
      local_338.m_backend.data._M_elems[7] = local_b48.data._M_elems[7];
      local_338.m_backend.data._M_elems[8] = local_b48.data._M_elems[8];
      local_338.m_backend.data._M_elems[9] = local_b48.data._M_elems[9];
      local_338.m_backend.exp = local_b48.exp;
      local_338.m_backend.neg = local_b48.neg;
      local_338.m_backend.fpclass = local_b48.fpclass;
      local_338.m_backend.prec_elem = local_b48.prec_elem;
      pTVar14 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      p_Var15 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        }
      }
      RVar72 = Tolerances::epsilon(pTVar14);
      bVar54 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_2f8,&local_338,RVar72);
      if (bVar54) {
        local_378._32_8_ = local_ab8._32_8_;
        local_378._29_3_ = local_ab8._29_3_;
        local_378._24_5_ = local_ab8._24_5_;
        local_378._16_8_ = local_ab8._16_8_;
        local_378._0_8_ = local_ab8._0_8_;
        local_378._8_8_ = local_ab8._8_8_;
        local_378._40_4_ = local_ab8._40_4_;
        local_378[0x2c] = (bool)local_ab8[0x2c];
        local_378._48_8_ = local_a88;
        local_3b8.m_backend.data._M_elems[0] = local_b88.data._M_elems[0];
        local_3b8.m_backend.data._M_elems[1] = local_b88.data._M_elems[1];
        local_3b8.m_backend.data._M_elems[2] = local_b88.data._M_elems[2];
        local_3b8.m_backend.data._M_elems[3] = local_b88.data._M_elems[3];
        local_3b8.m_backend.data._M_elems[4] = local_b88.data._M_elems[4];
        local_3b8.m_backend.data._M_elems[5] = local_b88.data._M_elems[5];
        local_3b8.m_backend.data._M_elems[6] = local_b88.data._M_elems[6];
        local_3b8.m_backend.data._M_elems[7] = local_b88.data._M_elems[7];
        local_3b8.m_backend.data._M_elems[8] = local_b88.data._M_elems[8];
        local_3b8.m_backend.data._M_elems[9] = local_b88.data._M_elems[9];
        local_3b8.m_backend.exp = local_b88.exp;
        local_3b8.m_backend.neg = local_b88.neg;
        local_3b8.m_backend.fpclass = local_b88.fpclass;
        local_3b8.m_backend.prec_elem = local_b88.prec_elem;
        pTVar14 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var16 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
        }
        RVar72 = Tolerances::epsilon(pTVar14);
        bVar54 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_378,&local_3b8,RVar72);
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
      }
      else {
        bVar54 = false;
      }
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
      if (bVar54 == false) {
        local_4f8._32_8_ = local_c08._32_8_;
        local_4f8._29_3_ = local_c08._29_3_;
        local_4f8._24_5_ = local_c08._24_5_;
        local_4f8._16_8_ = local_c08._16_8_;
        local_4f8._0_8_ = local_c08._0_8_;
        local_4f8._8_8_ = local_c08._8_8_;
        local_4f8._40_4_ = local_c08._40_4_;
        local_4f8[0x2c] = local_c08[0x2c];
        local_4f8._48_8_ = local_bd8;
        local_538.m_backend.data._M_elems[0] = local_cd8.data._M_elems[0];
        local_538.m_backend.data._M_elems[1] = local_cd8.data._M_elems[1];
        local_538.m_backend.data._M_elems[2] = local_cd8.data._M_elems[2];
        local_538.m_backend.data._M_elems[3] = local_cd8.data._M_elems[3];
        local_538.m_backend.data._M_elems[4] = local_cd8.data._M_elems[4];
        local_538.m_backend.data._M_elems[5] = local_cd8.data._M_elems[5];
        local_538.m_backend.data._M_elems[6] = local_cd8.data._M_elems[6];
        local_538.m_backend.data._M_elems[7] = local_cd8.data._M_elems[7];
        local_538.m_backend.data._M_elems[8] = local_cd8.data._M_elems[8];
        local_538.m_backend.data._M_elems[9] = local_cd8.data._M_elems[9];
        local_538.m_backend.exp = local_cd8.exp;
        local_538.m_backend.neg = local_cd8.neg;
        local_538.m_backend.fpclass = local_cd8.fpclass;
        local_538.m_backend.prec_elem = local_cd8.prec_elem;
        pTVar14 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var15 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
        }
        RVar72 = Tolerances::epsilon(pTVar14);
        bVar54 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_4f8,&local_538,RVar72);
        if (bVar54) {
          local_578._32_8_ = local_c48._32_8_;
          local_578._29_3_ = local_c48._29_3_;
          local_578._24_5_ = local_c48._24_5_;
          local_578._16_8_ = local_c48._16_8_;
          local_578._0_8_ = local_c48._0_8_;
          local_578._8_8_ = local_c48._8_8_;
          local_578._40_4_ = local_c48._40_4_;
          local_578[0x2c] = local_c48[0x2c];
          local_578._48_8_ = local_c18;
          local_5b8.m_backend.data._M_elems[0] = local_d18.data._M_elems[0];
          local_5b8.m_backend.data._M_elems[1] = local_d18.data._M_elems[1];
          local_5b8.m_backend.data._M_elems[2] = local_d18.data._M_elems[2];
          local_5b8.m_backend.data._M_elems[3] = local_d18.data._M_elems[3];
          local_5b8.m_backend.data._M_elems[4] = local_d18.data._M_elems[4];
          local_5b8.m_backend.data._M_elems[5] = local_d18.data._M_elems[5];
          local_5b8.m_backend.data._M_elems[6] = local_d18.data._M_elems[6];
          local_5b8.m_backend.data._M_elems[7] = local_d18.data._M_elems[7];
          local_5b8.m_backend.data._M_elems[8] = local_d18.data._M_elems[8];
          local_5b8.m_backend.data._M_elems[9] = local_d18.data._M_elems[9];
          local_5b8.m_backend.exp = local_d18.exp;
          local_5b8.m_backend.neg = local_d18.neg;
          local_5b8.m_backend.fpclass = local_d18.fpclass;
          local_5b8.m_backend.prec_elem = local_d18.prec_elem;
          pTVar14 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          p_Var16 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          RVar72 = Tolerances::epsilon(pTVar14);
          bVar54 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_578,&local_5b8,RVar72);
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
        }
        else {
          bVar54 = false;
        }
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        if (bVar54 == false) {
          local_e88._16_4_ = (undefined4)local_df8._32_8_;
          local_e88._20_4_ = SUB84(local_df8._32_8_,4);
          local_e88._0_4_ = (undefined4)local_df8._16_8_;
          local_e88._4_4_ = SUB84(local_df8._16_8_,4);
          local_e88._8_4_ = (undefined4)local_df8._24_8_;
          local_e88._12_4_ = SUB84(local_df8._24_8_,4);
          ptr.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr._0_4_ = (uint)local_df8._0_8_;
          ptr.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr._4_4_ = SUB84(local_df8._0_8_,4);
          ptr.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._0_4_ = (uint)local_df8._8_8_;
          ptr.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._4_4_ = SUB84(local_df8._8_8_,4);
          local_e6c = local_df8[0x2c];
          if ((local_df8[0x2c] == true) &&
             ((uint)ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != 0 || (fpclass_type)local_df8._48_8_ != cpp_dec_float_finite)) {
            local_e6c = false;
          }
          result_2.m_backend.data._M_elems._32_5_ = SUB85(local_da8._32_8_,0);
          result_2.m_backend.data._M_elems[9]._1_3_ = SUB83(local_da8._32_8_,5);
          result_2.m_backend.data._M_elems._24_5_ = SUB85(local_da8._24_8_,0);
          result_2.m_backend.data._M_elems[7]._1_3_ = SUB83(local_da8._24_8_,5);
          result_2.m_backend.exp = local_da8._40_4_;
          result_2.m_backend.neg = local_da8[0x2c];
          result_2.m_backend.fpclass = local_da8._48_4_;
          result_2.m_backend.prec_elem = local_da8._52_4_;
          if ((local_da8[0x2c] == true) &&
             (result_2.m_backend.data._M_elems[0] = (uint)local_da8._0_8_,
             result_2.m_backend.data._M_elems[0] != 0 ||
             (fpclass_type)local_da8._48_8_ != cpp_dec_float_finite)) {
            result_2.m_backend.neg = false;
          }
          if ((fpclass_type)local_da8._48_8_ != cpp_dec_float_NaN &&
              (fpclass_type)local_df8._48_8_ != cpp_dec_float_NaN) goto LAB_0031b556;
        }
      }
      else {
        local_3f8._32_8_ = local_c08._32_8_;
        local_3f8._29_3_ = local_c08._29_3_;
        local_3f8._24_5_ = local_c08._24_5_;
        local_3f8._16_8_ = local_c08._16_8_;
        local_3f8._0_8_ = local_c08._0_8_;
        local_3f8._8_8_ = local_c08._8_8_;
        local_3f8._40_4_ = local_c08._40_4_;
        local_3f8[0x2c] = local_c08[0x2c];
        local_3f8._48_8_ = local_bd8;
        local_438.m_backend.data._M_elems[0] = local_cd8.data._M_elems[0];
        local_438.m_backend.data._M_elems[1] = local_cd8.data._M_elems[1];
        local_438.m_backend.data._M_elems[2] = local_cd8.data._M_elems[2];
        local_438.m_backend.data._M_elems[3] = local_cd8.data._M_elems[3];
        local_438.m_backend.data._M_elems[4] = local_cd8.data._M_elems[4];
        local_438.m_backend.data._M_elems[5] = local_cd8.data._M_elems[5];
        local_438.m_backend.data._M_elems[6] = local_cd8.data._M_elems[6];
        local_438.m_backend.data._M_elems[7] = local_cd8.data._M_elems[7];
        local_438.m_backend.data._M_elems[8] = local_cd8.data._M_elems[8];
        local_438.m_backend.data._M_elems[9] = local_cd8.data._M_elems[9];
        local_438.m_backend.exp = local_cd8.exp;
        local_438.m_backend.neg = local_cd8.neg;
        local_438.m_backend.fpclass = local_cd8.fpclass;
        local_438.m_backend.prec_elem = local_cd8.prec_elem;
        pTVar14 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var15 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
        }
        RVar72 = Tolerances::epsilon(pTVar14);
        bVar54 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_3f8,&local_438,RVar72);
        if (bVar54) {
          local_478._32_8_ = local_c48._32_8_;
          local_478._29_3_ = local_c48._29_3_;
          local_478._24_5_ = local_c48._24_5_;
          local_478._16_8_ = local_c48._16_8_;
          local_478._0_8_ = local_c48._0_8_;
          local_478._8_8_ = local_c48._8_8_;
          local_478._40_4_ = local_c48._40_4_;
          local_478[0x2c] = local_c48[0x2c];
          local_478._48_8_ = local_c18;
          local_4b8.m_backend.data._M_elems[0] = local_d18.data._M_elems[0];
          local_4b8.m_backend.data._M_elems[1] = local_d18.data._M_elems[1];
          local_4b8.m_backend.data._M_elems[2] = local_d18.data._M_elems[2];
          local_4b8.m_backend.data._M_elems[3] = local_d18.data._M_elems[3];
          local_4b8.m_backend.data._M_elems[4] = local_d18.data._M_elems[4];
          local_4b8.m_backend.data._M_elems[5] = local_d18.data._M_elems[5];
          local_4b8.m_backend.data._M_elems[6] = local_d18.data._M_elems[6];
          local_4b8.m_backend.data._M_elems[7] = local_d18.data._M_elems[7];
          local_4b8.m_backend.data._M_elems[8] = local_d18.data._M_elems[8];
          local_4b8.m_backend.data._M_elems[9] = local_d18.data._M_elems[9];
          local_4b8.m_backend.exp = local_d18.exp;
          local_4b8.m_backend.neg = local_d18.neg;
          local_4b8.m_backend.fpclass = local_d18.fpclass;
          local_4b8.m_backend.prec_elem = local_d18.prec_elem;
          pTVar14 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          p_Var16 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          RVar72 = Tolerances::epsilon(pTVar14);
          bVar54 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_478,&local_4b8,RVar72);
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
        }
        else {
          bVar54 = false;
        }
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        if (bVar54 == false) goto LAB_0031b569;
        local_e88._16_4_ = (undefined4)local_df8._32_8_;
        local_e88._20_4_ = SUB84(local_df8._32_8_,4);
        local_e88._0_4_ = (undefined4)local_df8._16_8_;
        local_e88._4_4_ = SUB84(local_df8._16_8_,4);
        local_e88._8_4_ = (undefined4)local_df8._24_8_;
        local_e88._12_4_ = SUB84(local_df8._24_8_,4);
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr._0_4_ = (uint)local_df8._0_8_;
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr._4_4_ = SUB84(local_df8._0_8_,4);
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._0_4_ = (uint)local_df8._8_8_;
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._4_4_ = SUB84(local_df8._8_8_,4);
        local_e6c = local_df8[0x2c];
        if ((local_df8[0x2c] == true) &&
           ((uint)ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr != 0 || (fpclass_type)local_df8._48_8_ != cpp_dec_float_finite)) {
          local_e6c = false;
        }
        result_2.m_backend.data._M_elems._32_5_ = SUB85(local_da8._32_8_,0);
        result_2.m_backend.data._M_elems[9]._1_3_ = SUB83(local_da8._32_8_,5);
        result_2.m_backend.data._M_elems._24_5_ = SUB85(local_da8._24_8_,0);
        result_2.m_backend.data._M_elems[7]._1_3_ = SUB83(local_da8._24_8_,5);
        result_2.m_backend.exp = local_da8._40_4_;
        result_2.m_backend.neg = local_da8[0x2c];
        result_2.m_backend.fpclass = local_da8._48_4_;
        result_2.m_backend.prec_elem = local_da8._52_4_;
        if ((local_da8[0x2c] == true) &&
           (result_2.m_backend.data._M_elems[0] = (uint)local_da8._0_8_,
           result_2.m_backend.data._M_elems[0] != 0 ||
           (fpclass_type)local_da8._48_8_ != cpp_dec_float_finite)) {
          result_2.m_backend.neg = false;
        }
        if ((fpclass_type)local_da8._48_8_ != cpp_dec_float_NaN &&
            (fpclass_type)local_df8._48_8_ != cpp_dec_float_NaN) {
LAB_0031b556:
          local_e88._24_4_ = local_df8._40_4_;
          local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_df8._48_8_;
          result_2.m_backend.data._M_elems._16_8_ = local_da8._16_8_;
          result_2.m_backend.exp = local_da8._40_4_;
          result_2.m_backend._48_8_ = local_da8._48_8_;
          result_2.m_backend.data._M_elems._0_8_ = local_da8._0_8_;
          result_2.m_backend.data._M_elems._8_8_ = local_da8._8_8_;
          iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_2.m_backend);
          if (0 < iVar56) goto LAB_0031b569;
        }
      }
      goto LAB_0031b58e;
    }
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
    if ((((fpclass_type)local_c18 == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_c48,&result_2.m_backend),
       iVar56 < 0)) goto LAB_0031ab99;
LAB_0031b569:
    local_e4c = local_e54;
    local_e54 = local_e50;
    lVar66 = local_ce0;
    local_ce0 = local_d70;
  }
  else {
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
    if ((((fpclass_type)local_a88 == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_ab8,&result_2.m_backend),
       iVar56 < 0)) goto LAB_0031ab36;
LAB_0031b58e:
    uVar53 = local_b48._48_8_;
    bVar52 = local_b48.neg;
    iVar7 = local_b48.exp;
    uVar50 = local_b48.data._M_elems._32_8_;
    uVar48 = local_b48.data._M_elems._24_8_;
    uVar46 = local_b48.data._M_elems._16_8_;
    uVar44 = local_b48.data._M_elems._8_8_;
    uVar41 = local_b48.data._M_elems._0_8_;
    uVar40 = local_b88._48_8_;
    bVar42 = local_b88.neg;
    iVar56 = local_b88.exp;
    uVar39 = local_b88.data._M_elems._32_8_;
    uVar38 = local_b88.data._M_elems._24_8_;
    uVar37 = local_b88.data._M_elems._16_8_;
    uVar36 = local_b88.data._M_elems._8_8_;
    uVar35 = local_b88.data._M_elems._0_8_;
    uVar33 = local_df8._48_8_;
    bVar54 = local_df8[0x2c];
    uVar32 = local_df8._40_4_;
    uVar30 = local_df8._32_8_;
    uVar28 = local_df8._24_8_;
    uVar22 = local_df8._16_8_;
    uVar20 = local_df8._8_8_;
    uVar11 = local_df8._0_8_;
    result_2.m_backend.data._M_elems._32_5_ = local_b48.data._M_elems._32_5_;
    result_2.m_backend.data._M_elems[9]._1_3_ = local_b48.data._M_elems[9]._1_3_;
    result_2.m_backend.data._M_elems[4] = local_b48.data._M_elems[4];
    result_2.m_backend.data._M_elems[5] = local_b48.data._M_elems[5];
    result_2.m_backend.data._M_elems._24_5_ = local_b48.data._M_elems._24_5_;
    result_2.m_backend.data._M_elems[7]._1_3_ = local_b48.data._M_elems[7]._1_3_;
    result_2.m_backend.data._M_elems[0] = local_b48.data._M_elems[0];
    result_2.m_backend.data._M_elems[1] = local_b48.data._M_elems[1];
    result_2.m_backend.data._M_elems[2] = local_b48.data._M_elems[2];
    result_2.m_backend.data._M_elems[3] = local_b48.data._M_elems[3];
    aggr_const.m_backend.data._M_elems._32_5_ = local_b88.data._M_elems._32_5_;
    aggr_const.m_backend.data._M_elems[9]._1_3_ = local_b88.data._M_elems[9]._1_3_;
    aggr_const.m_backend.data._M_elems[4] = local_b88.data._M_elems[4];
    aggr_const.m_backend.data._M_elems[5] = local_b88.data._M_elems[5];
    aggr_const.m_backend.data._M_elems._24_5_ = local_b88.data._M_elems._24_5_;
    aggr_const.m_backend.data._M_elems[7]._1_3_ = local_b88.data._M_elems[7]._1_3_;
    aggr_const.m_backend.data._M_elems[0] = local_b88.data._M_elems[0];
    aggr_const.m_backend.data._M_elems[1] = local_b88.data._M_elems[1];
    aggr_const.m_backend.data._M_elems[2] = local_b88.data._M_elems[2];
    aggr_const.m_backend.data._M_elems[3] = local_b88.data._M_elems[3];
    local_df8._32_8_ = local_da8._32_8_;
    uVar31 = local_df8._32_8_;
    local_df8._16_8_ = local_da8._16_8_;
    uVar23 = local_df8._16_8_;
    local_df8._24_8_ = local_da8._24_8_;
    uVar29 = local_df8._24_8_;
    local_df8._0_8_ = local_da8._0_8_;
    uVar13 = local_df8._0_8_;
    local_df8._8_8_ = local_da8._8_8_;
    uVar21 = local_df8._8_8_;
    local_df8._40_4_ = local_da8._40_4_;
    local_df8[0x2c] = local_da8[0x2c];
    local_df8._32_4_ = (undefined4)uVar30;
    local_df8._36_4_ = SUB84(uVar30,4);
    local_da8._32_4_ = local_df8._32_4_;
    local_da8._36_4_ = local_df8._36_4_;
    local_df8._0_4_ = (undefined4)uVar11;
    local_df8._4_4_ = SUB84(uVar11,4);
    local_da8._0_4_ = local_df8._0_4_;
    local_da8._4_4_ = local_df8._4_4_;
    local_df8._8_4_ = (undefined4)uVar20;
    local_df8._12_4_ = SUB84(uVar20,4);
    local_da8._8_4_ = local_df8._8_4_;
    local_da8._12_4_ = local_df8._12_4_;
    local_df8._16_4_ = (undefined4)uVar22;
    local_df8._20_4_ = SUB84(uVar22,4);
    local_da8._16_4_ = local_df8._16_4_;
    local_da8._20_4_ = local_df8._20_4_;
    local_df8._24_4_ = (undefined4)uVar28;
    local_df8._28_4_ = SUB84(uVar28,4);
    local_da8._24_4_ = local_df8._24_4_;
    local_da8._28_4_ = local_df8._28_4_;
    local_da8._40_4_ = uVar32;
    local_da8[0x2c] = bVar54;
    local_df8._48_8_ = local_da8._48_8_;
    local_da8._48_8_ = uVar33;
    local_b48.data._M_elems[8] = local_cd8.data._M_elems[8];
    local_b48.data._M_elems[9] = local_cd8.data._M_elems[9];
    uVar51 = local_b48.data._M_elems._32_8_;
    local_b48.data._M_elems[4] = local_cd8.data._M_elems[4];
    local_b48.data._M_elems[5] = local_cd8.data._M_elems[5];
    uVar47 = local_b48.data._M_elems._16_8_;
    local_b48.data._M_elems[6] = local_cd8.data._M_elems[6];
    local_b48.data._M_elems[7] = local_cd8.data._M_elems[7];
    uVar49 = local_b48.data._M_elems._24_8_;
    local_b48.data._M_elems[0] = local_cd8.data._M_elems[0];
    local_b48.data._M_elems[1] = local_cd8.data._M_elems[1];
    uVar43 = local_b48.data._M_elems._0_8_;
    local_b48.data._M_elems[2] = local_cd8.data._M_elems[2];
    local_b48.data._M_elems[3] = local_cd8.data._M_elems[3];
    uVar45 = local_b48.data._M_elems._8_8_;
    local_b48.exp = local_cd8.exp;
    local_b48.neg = local_cd8.neg;
    local_b48.data._M_elems[8] = (uint)uVar50;
    local_b48.data._M_elems[9] = SUB84(uVar50,4);
    local_cd8.data._M_elems[8] = local_b48.data._M_elems[8];
    local_cd8.data._M_elems[9] = local_b48.data._M_elems[9];
    local_b48.data._M_elems[6] = (uint)uVar48;
    local_b48.data._M_elems[7] = SUB84(uVar48,4);
    local_cd8.data._M_elems[6] = local_b48.data._M_elems[6];
    local_cd8.data._M_elems[7] = local_b48.data._M_elems[7];
    local_b48.data._M_elems[4] = (uint)uVar46;
    local_b48.data._M_elems[5] = SUB84(uVar46,4);
    local_cd8.data._M_elems[4] = local_b48.data._M_elems[4];
    local_cd8.data._M_elems[5] = local_b48.data._M_elems[5];
    local_b48.data._M_elems[0] = (uint)uVar41;
    local_b48.data._M_elems[1] = SUB84(uVar41,4);
    local_cd8.data._M_elems[0] = local_b48.data._M_elems[0];
    local_cd8.data._M_elems[1] = local_b48.data._M_elems[1];
    local_b48.data._M_elems[2] = (uint)uVar44;
    local_b48.data._M_elems[3] = SUB84(uVar44,4);
    local_cd8.data._M_elems[2] = local_b48.data._M_elems[2];
    local_cd8.data._M_elems[3] = local_b48.data._M_elems[3];
    local_cd8.exp = iVar7;
    local_cd8.neg = bVar52;
    local_b48.fpclass = local_cd8.fpclass;
    local_b48.prec_elem = local_cd8.prec_elem;
    uVar41 = local_b48._48_8_;
    local_b48.fpclass = (fpclass_type)uVar53;
    local_b48.prec_elem = SUB84(uVar53,4);
    local_cd8.fpclass = local_b48.fpclass;
    local_cd8.prec_elem = local_b48.prec_elem;
    local_b88.data._M_elems[8] = local_d18.data._M_elems[8];
    local_b88.data._M_elems[9] = local_d18.data._M_elems[9];
    uVar30 = local_b88.data._M_elems._32_8_;
    local_b88.data._M_elems[4] = local_d18.data._M_elems[4];
    local_b88.data._M_elems[5] = local_d18.data._M_elems[5];
    uVar22 = local_b88.data._M_elems._16_8_;
    local_b88.data._M_elems[6] = local_d18.data._M_elems[6];
    local_b88.data._M_elems[7] = local_d18.data._M_elems[7];
    uVar28 = local_b88.data._M_elems._24_8_;
    local_b88.data._M_elems[0] = local_d18.data._M_elems[0];
    local_b88.data._M_elems[1] = local_d18.data._M_elems[1];
    uVar11 = local_b88.data._M_elems._0_8_;
    local_b88.data._M_elems[2] = local_d18.data._M_elems[2];
    local_b88.data._M_elems[3] = local_d18.data._M_elems[3];
    uVar20 = local_b88.data._M_elems._8_8_;
    local_b88.exp = local_d18.exp;
    local_b88.neg = local_d18.neg;
    local_b88.data._M_elems[8] = (uint)uVar39;
    local_b88.data._M_elems[9] = SUB84(uVar39,4);
    local_d18.data._M_elems[8] = local_b88.data._M_elems[8];
    local_d18.data._M_elems[9] = local_b88.data._M_elems[9];
    local_b88.data._M_elems[6] = (uint)uVar38;
    local_b88.data._M_elems[7] = SUB84(uVar38,4);
    local_d18.data._M_elems[6] = local_b88.data._M_elems[6];
    local_d18.data._M_elems[7] = local_b88.data._M_elems[7];
    local_b88.data._M_elems[4] = (uint)uVar37;
    local_b88.data._M_elems[5] = SUB84(uVar37,4);
    local_d18.data._M_elems[4] = local_b88.data._M_elems[4];
    local_d18.data._M_elems[5] = local_b88.data._M_elems[5];
    local_b88.data._M_elems[0] = (uint)uVar35;
    local_b88.data._M_elems[1] = SUB84(uVar35,4);
    local_d18.data._M_elems[0] = local_b88.data._M_elems[0];
    local_d18.data._M_elems[1] = local_b88.data._M_elems[1];
    local_b88.data._M_elems[2] = (uint)uVar36;
    local_b88.data._M_elems[3] = SUB84(uVar36,4);
    local_d18.data._M_elems[2] = local_b88.data._M_elems[2];
    local_d18.data._M_elems[3] = local_b88.data._M_elems[3];
    local_d18.exp = iVar56;
    local_d18.neg = bVar42;
    local_b88.fpclass = local_d18.fpclass;
    local_b88.prec_elem = local_d18.prec_elem;
    uVar33 = local_b88._48_8_;
    local_b88.fpclass = (fpclass_type)uVar40;
    local_b88.prec_elem = SUB84(uVar40,4);
    local_d18.fpclass = local_b88.fpclass;
    local_d18.prec_elem = local_b88.prec_elem;
    local_e4c = local_e50;
    lVar66 = local_d70;
    local_df8._0_8_ = uVar13;
    local_df8._8_8_ = uVar21;
    local_df8._16_8_ = uVar23;
    local_df8._24_8_ = uVar29;
    local_df8._32_8_ = uVar31;
    local_b88.data._M_elems._0_8_ = uVar11;
    local_b88.data._M_elems._8_8_ = uVar20;
    local_b88.data._M_elems._16_8_ = uVar22;
    local_b88.data._M_elems._24_8_ = uVar28;
    local_b88.data._M_elems._32_8_ = uVar30;
    local_b88._48_8_ = uVar33;
    local_b48.data._M_elems._0_8_ = uVar43;
    local_b48.data._M_elems._8_8_ = uVar45;
    local_b48.data._M_elems._16_8_ = uVar47;
    local_b48.data._M_elems._24_8_ = uVar49;
    local_b48.data._M_elems._32_8_ = uVar51;
    local_b48._48_8_ = uVar41;
  }
  pIVar17 = (pSVar34->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem;
  pDVar18 = (pSVar34->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey;
  iVar56 = pDVar18[local_ce0].idx;
  iVar7 = pDVar18[lVar66].idx;
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  local_e88._0_4_ = 0;
  local_e88._4_4_ = 0;
  local_e88._8_4_ = 0;
  local_e88._12_4_ = 0;
  local_e88._16_4_ = 0;
  local_e88._20_4_ = 0;
  local_e88._24_4_ = 0;
  local_e6c = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)&ptr,(cpp_dec_float<50U,_int,_void> *)local_da8,
             (cpp_dec_float<50U,_int,_void> *)local_df8);
  local_948 = CONCAT44((uint)ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi,
                       ptr.
                       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._4_4_);
  uStack_940 = CONCAT44(local_e88._0_4_,
                        ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._4_4_);
  local_938 = CONCAT44(local_e88._8_4_,local_e88._4_4_);
  uStack_930 = CONCAT44(local_e88._16_4_,local_e88._12_4_);
  local_928 = local_e88._20_4_;
  _local_a38 = CONCAT44(iStack_a34,local_e88._24_4_);
  local_d70 = CONCAT44(local_d70._4_4_,local_e68._M_pi._4_4_);
  local_c98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_c98._4_4_,
                       (uint)ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
  local_e50 = (fpclass_type)local_e68._M_pi;
  bVar55 = ((uint)ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr != 0 || (fpclass_type)local_e68._M_pi != cpp_dec_float_finite) ^ local_e6c
  ;
  aggr_const.m_backend.fpclass = cpp_dec_float_finite;
  aggr_const.m_backend.prec_elem = 10;
  aggr_const.m_backend.data._M_elems[0] = 0;
  aggr_const.m_backend.data._M_elems[1] = 0;
  aggr_const.m_backend.data._M_elems[2] = 0;
  aggr_const.m_backend.data._M_elems[3] = 0;
  aggr_const.m_backend.data._M_elems[4] = 0;
  aggr_const.m_backend.data._M_elems[5] = 0;
  aggr_const.m_backend.data._M_elems._24_5_ = 0;
  aggr_const.m_backend.data._M_elems[7]._1_3_ = 0;
  aggr_const.m_backend.data._M_elems._32_5_ = 0;
  aggr_const.m_backend.data._M_elems[9]._1_3_ = 0;
  aggr_const.m_backend.exp = 0;
  aggr_const.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&aggr_const.m_backend,(cpp_dec_float<50U,_int,_void> *)local_d68,
             (cpp_dec_float<50U,_int,_void> *)local_df8);
  if (0 < pIVar17[iVar56].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar66 = 0;
    do {
      pNVar9 = pIVar17[iVar56].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      uVar69 = pNVar9[lVar66].idx;
      uVar11 = *(undefined8 *)(pNVar9[lVar66].val.m_backend.data._M_elems + 8);
      local_e88._16_4_ = (undefined4)uVar11;
      local_e88._20_4_ = (undefined4)((ulong)uVar11 >> 0x20);
      uVar11 = *(undefined8 *)&pNVar9[lVar66].val.m_backend.data;
      uVar13 = *(undefined8 *)(pNVar9[lVar66].val.m_backend.data._M_elems + 2);
      puVar1 = pNVar9[lVar66].val.m_backend.data._M_elems + 4;
      uVar20 = *(undefined8 *)puVar1;
      uVar21 = *(undefined8 *)(puVar1 + 2);
      local_e88._0_4_ = (undefined4)uVar20;
      local_e88._4_4_ = (undefined4)((ulong)uVar20 >> 0x20);
      local_e88._8_4_ = (undefined4)uVar21;
      local_e88._12_4_ = (undefined4)((ulong)uVar21 >> 0x20);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = (uint)uVar11;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = (uint)((ulong)uVar11 >> 0x20);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = (uint)uVar13;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = (uint)((ulong)uVar13 >> 0x20);
      local_e88._24_4_ = pNVar9[lVar66].val.m_backend.exp;
      local_e6c = pNVar9[lVar66].val.m_backend.neg;
      local_e68._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&pNVar9[lVar66].val.m_backend.fpclass;
      if (uVar69 != *i) {
        pnVar8 = (local_dc0->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = *(undefined8 *)(pnVar8[(int)uVar69].m_backend.data._M_elems + 8);
        result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar11,0);
        result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
        result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[(int)uVar69].m_backend.data;
        result_2.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar8[(int)uVar69].m_backend.data._M_elems + 2);
        puVar1 = pnVar8[(int)uVar69].m_backend.data._M_elems + 4;
        result_2.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar11 = *(undefined8 *)(puVar1 + 2);
        result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar11,0);
        result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
        result_2.m_backend.exp = pnVar8[(int)uVar69].m_backend.exp;
        result_2.m_backend.neg = pnVar8[(int)uVar69].m_backend.neg;
        result_2.m_backend.fpclass = pnVar8[(int)uVar69].m_backend.fpclass;
        result_2.m_backend.prec_elem = pnVar8[(int)uVar69].m_backend.prec_elem;
        pnVar8 = (local_dc0->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        obj_j.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar8[(int)uVar69].m_backend.data._M_elems + 8);
        obj_j.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[(int)uVar69].m_backend.data;
        obj_j.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar8[(int)uVar69].m_backend.data._M_elems + 2);
        puVar1 = pnVar8[(int)uVar69].m_backend.data._M_elems + 4;
        obj_j.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        obj_j.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        obj_j.m_backend.exp = pnVar8[(int)uVar69].m_backend.exp;
        obj_j.m_backend.neg = pnVar8[(int)uVar69].m_backend.neg;
        obj_j.m_backend.fpclass = pnVar8[(int)uVar69].m_backend.fpclass;
        obj_j.m_backend.prec_elem = pnVar8[(int)uVar69].m_backend.prec_elem;
        ::soplex::infinity::__tls_init();
        scale1.m_backend.fpclass = cpp_dec_float_finite;
        scale1.m_backend.prec_elem = 10;
        scale1.m_backend.data._M_elems[0] = 0;
        scale1.m_backend.data._M_elems[1] = 0;
        scale1.m_backend.data._M_elems[2] = 0;
        scale1.m_backend.data._M_elems[3] = 0;
        scale1.m_backend.data._M_elems[4] = 0;
        scale1.m_backend.data._M_elems[5] = 0;
        scale1.m_backend.data._M_elems[6] = 0;
        scale1.m_backend.data._M_elems[7] = 0;
        scale1.m_backend.data._M_elems[8] = 0;
        scale1.m_backend.data._M_elems[9] = 0;
        scale1.m_backend.exp = 0;
        scale1.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&scale1.m_backend,local_db8);
        if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
            (scale1.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar57 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_2.m_backend,&scale1.m_backend), 0 < iVar57)) {
          scale2.m_backend.data._M_elems[9]._1_3_ = aggr_const.m_backend.data._M_elems[9]._1_3_;
          scale2.m_backend.data._M_elems._32_5_ = aggr_const.m_backend.data._M_elems._32_5_;
          scale2.m_backend.data._M_elems[7]._1_3_ = aggr_const.m_backend.data._M_elems[7]._1_3_;
          scale2.m_backend.data._M_elems._24_5_ = aggr_const.m_backend.data._M_elems._24_5_;
          scale2.m_backend.data._M_elems[4] = aggr_const.m_backend.data._M_elems[4];
          scale2.m_backend.data._M_elems[5] = aggr_const.m_backend.data._M_elems[5];
          scale2.m_backend.data._M_elems[0] = aggr_const.m_backend.data._M_elems[0];
          scale2.m_backend.data._M_elems[1] = aggr_const.m_backend.data._M_elems[1];
          scale2.m_backend.data._M_elems[2] = aggr_const.m_backend.data._M_elems[2];
          scale2.m_backend.data._M_elems[3] = aggr_const.m_backend.data._M_elems[3];
          scale2.m_backend.exp = aggr_const.m_backend.exp;
          scale2.m_backend.neg = aggr_const.m_backend.neg;
          scale2.m_backend.fpclass = aggr_const.m_backend.fpclass;
          scale2.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&scale2.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
          scale1.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
          scale1.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
          scale1.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
          scale1.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
          scale1.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
          scale1.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
          scale1.m_backend.data._M_elems[6] = result_2.m_backend.data._M_elems[6];
          scale1.m_backend.data._M_elems[7] =
               (uint)(CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                               result_2.m_backend.data._M_elems._24_5_) >> 0x20);
          scale1.m_backend.data._M_elems[8] = result_2.m_backend.data._M_elems[8];
          scale1.m_backend.data._M_elems[9] =
               (uint)(CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                               result_2.m_backend.data._M_elems._32_5_) >> 0x20);
          scale1.m_backend.exp = result_2.m_backend.exp;
          scale1.m_backend.neg = result_2.m_backend.neg;
          scale1.m_backend.fpclass = result_2.m_backend.fpclass;
          scale1.m_backend.prec_elem = result_2.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&scale1.m_backend,&scale2.m_backend);
          (*(local_dc0->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x33])(local_dc0,(ulong)uVar69,&scale1.m_backend,0);
          piVar19 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_chgLRhs;
          *piVar19 = *piVar19 + 1;
        }
        ::soplex::infinity::__tls_init();
        scale1.m_backend.fpclass = cpp_dec_float_finite;
        scale1.m_backend.prec_elem = 10;
        scale1.m_backend.data._M_elems[0] = 0;
        scale1.m_backend.data._M_elems[1] = 0;
        scale1.m_backend.data._M_elems[2] = 0;
        scale1.m_backend.data._M_elems[3] = 0;
        scale1.m_backend.data._M_elems[4] = 0;
        scale1.m_backend.data._M_elems[5] = 0;
        scale1.m_backend.data._M_elems[6] = 0;
        scale1.m_backend.data._M_elems[7] = 0;
        scale1.m_backend.data._M_elems[8] = 0;
        scale1.m_backend.data._M_elems[9] = 0;
        scale1.m_backend.exp = 0;
        scale1.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&scale1.m_backend,(double)local_d28._0_8_);
        if (((obj_j.m_backend.fpclass != cpp_dec_float_NaN) &&
            (scale1.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar57 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&obj_j.m_backend,&scale1.m_backend), iVar57 < 0)) {
          scale2.m_backend.data._M_elems[9]._1_3_ = aggr_const.m_backend.data._M_elems[9]._1_3_;
          scale2.m_backend.data._M_elems._32_5_ = aggr_const.m_backend.data._M_elems._32_5_;
          scale2.m_backend.data._M_elems[7]._1_3_ = aggr_const.m_backend.data._M_elems[7]._1_3_;
          scale2.m_backend.data._M_elems._24_5_ = aggr_const.m_backend.data._M_elems._24_5_;
          scale2.m_backend.data._M_elems[4] = aggr_const.m_backend.data._M_elems[4];
          scale2.m_backend.data._M_elems[5] = aggr_const.m_backend.data._M_elems[5];
          scale2.m_backend.data._M_elems[0] = aggr_const.m_backend.data._M_elems[0];
          scale2.m_backend.data._M_elems[1] = aggr_const.m_backend.data._M_elems[1];
          scale2.m_backend.data._M_elems[2] = aggr_const.m_backend.data._M_elems[2];
          scale2.m_backend.data._M_elems[3] = aggr_const.m_backend.data._M_elems[3];
          scale2.m_backend.exp = aggr_const.m_backend.exp;
          scale2.m_backend.neg = aggr_const.m_backend.neg;
          scale2.m_backend.fpclass = aggr_const.m_backend.fpclass;
          scale2.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&scale2.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
          scale1.m_backend.data._M_elems[0] = obj_j.m_backend.data._M_elems[0];
          scale1.m_backend.data._M_elems[1] = obj_j.m_backend.data._M_elems[1];
          scale1.m_backend.data._M_elems[2] = obj_j.m_backend.data._M_elems[2];
          scale1.m_backend.data._M_elems[3] = obj_j.m_backend.data._M_elems[3];
          scale1.m_backend.data._M_elems[4] = obj_j.m_backend.data._M_elems[4];
          scale1.m_backend.data._M_elems[5] = obj_j.m_backend.data._M_elems[5];
          scale1.m_backend.data._M_elems[6] = obj_j.m_backend.data._M_elems[6];
          scale1.m_backend.data._M_elems[7] = obj_j.m_backend.data._M_elems[7];
          scale1.m_backend.data._M_elems[8] = obj_j.m_backend.data._M_elems[8];
          scale1.m_backend.data._M_elems[9] = obj_j.m_backend.data._M_elems[9];
          scale1.m_backend.exp = obj_j.m_backend.exp;
          scale1.m_backend.neg = obj_j.m_backend.neg;
          scale1.m_backend.fpclass = obj_j.m_backend.fpclass;
          scale1.m_backend.prec_elem = obj_j.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&scale1.m_backend,&scale2.m_backend);
          (*(local_dc0->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x36])(local_dc0,(ulong)uVar69,&scale1.m_backend,0);
          piVar19 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_chgLRhs;
          *piVar19 = *piVar19 + 1;
        }
        scale1.m_backend.data._M_elems[0] = (fpclass_type)local_c98;
        scale1.m_backend.data._M_elems[9] = local_928;
        scale1.m_backend.data._M_elems[5] = (uint)local_938;
        scale1.m_backend.data._M_elems[6] = (uint)((ulong)local_938 >> 0x20);
        scale1.m_backend.data._M_elems[7] = (uint)uStack_930;
        scale1.m_backend.data._M_elems[8] = (uint)((ulong)uStack_930 >> 0x20);
        scale1.m_backend.data._M_elems[1] = (uint)local_948;
        scale1.m_backend.data._M_elems[2] = (uint)((ulong)local_948 >> 0x20);
        scale1.m_backend.data._M_elems[3] = (uint)uStack_940;
        scale1.m_backend.data._M_elems[4] = (uint)((ulong)uStack_940 >> 0x20);
        scale1.m_backend.exp = local_a38;
        scale1.m_backend.prec_elem = (int32_t)local_d70;
        scale1.m_backend.fpclass = local_e50;
        scale1.m_backend.neg = (bool)bVar55;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&scale1.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
        pNVar9 = pIVar17[iVar7].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        if ((pNVar9 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x0) &&
           (lVar61 = (long)pIVar17[iVar7].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused, 0 < lVar61)) {
          lVar62 = 0;
          do {
            if (*(uint *)((long)(&pNVar9->val + 1) + lVar62) == uVar69) {
              scale2.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + lVar62 + 0x20);
              puVar1 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + lVar62);
              scale2.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
              scale2.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + lVar62 + 0x10);
              scale2.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              scale2.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
              scale2.m_backend.exp = *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar62);
              scale2.m_backend.neg =
                   *(bool *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar62 + 4);
              scale2.m_backend._48_8_ =
                   *(undefined8 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar62 + 8);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&scale1.m_backend,&scale2.m_backend);
              piVar19 = &(this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).m_remNzos;
              *piVar19 = *piVar19 + 1;
              break;
            }
            lVar62 = lVar62 + 0x3c;
          } while (lVar61 * 0x3c - lVar62 != 0);
        }
        (*(local_dc0->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x43])(local_dc0,(ulong)uVar69,(ulong)local_e4c,&scale1.m_backend,0);
      }
      lVar66 = lVar66 + 1;
    } while (lVar66 < pIVar17[iVar56].data.
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::obj(&obj_j,local_dc0,local_e54);
  uVar23 = obj_j.m_backend._48_8_;
  bVar54 = obj_j.m_backend.neg;
  iVar56 = obj_j.m_backend.exp;
  uVar22 = obj_j.m_backend.data._M_elems._32_8_;
  uVar21 = obj_j.m_backend.data._M_elems._24_8_;
  uVar20 = obj_j.m_backend.data._M_elems._16_8_;
  uVar13 = obj_j.m_backend.data._M_elems._8_8_;
  uVar11 = obj_j.m_backend.data._M_elems._0_8_;
  local_958 = obj_j.m_backend.fpclass;
  iStack_954 = obj_j.m_backend.prec_elem;
  uStack_950 = 0;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_210,this);
  local_e88._16_4_ = (undefined4)uVar22;
  local_e88._20_4_ = SUB84(uVar22,4);
  local_e88._0_4_ = (undefined4)uVar20;
  local_e88._4_4_ = SUB84(uVar20,4);
  local_e88._8_4_ = (undefined4)uVar21;
  local_e88._12_4_ = SUB84(uVar21,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)uVar11;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = SUB84(uVar11,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = (uint)uVar13;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = SUB84(uVar13,4);
  local_e88._24_4_ = iVar56;
  local_e6c = bVar54;
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23;
  if ((bVar54 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || local_958 != cpp_dec_float_finite)) {
    local_e6c = false;
  }
  if (((local_958 != cpp_dec_float_NaN) && (local_210.fpclass != cpp_dec_float_NaN)) &&
     (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_210), 0 < iVar56)) {
    result_35.m_backend.data._M_elems[9]._1_3_ = aggr_const.m_backend.data._M_elems[9]._1_3_;
    result_35.m_backend.data._M_elems._32_5_ = aggr_const.m_backend.data._M_elems._32_5_;
    result_35.m_backend.data._M_elems[7]._1_3_ = aggr_const.m_backend.data._M_elems[7]._1_3_;
    result_35.m_backend.data._M_elems._24_5_ = aggr_const.m_backend.data._M_elems._24_5_;
    result_35.m_backend.data._M_elems[4] = aggr_const.m_backend.data._M_elems[4];
    result_35.m_backend.data._M_elems[5] = aggr_const.m_backend.data._M_elems[5];
    result_35.m_backend.data._M_elems[0] = aggr_const.m_backend.data._M_elems[0];
    result_35.m_backend.data._M_elems[1] = aggr_const.m_backend.data._M_elems[1];
    result_35.m_backend.data._M_elems[2] = aggr_const.m_backend.data._M_elems[2];
    result_35.m_backend.data._M_elems[3] = aggr_const.m_backend.data._M_elems[3];
    result_35.m_backend.exp = aggr_const.m_backend.exp;
    result_35.m_backend.neg = aggr_const.m_backend.neg;
    result_35.m_backend.fpclass = aggr_const.m_backend.fpclass;
    result_35.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result_35.m_backend,&obj_j.m_backend);
    (*(this->
      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxSimplifier[0x11])(this,&result_35.m_backend);
    pSVar34 = local_dc0;
    uVar69 = local_e4c;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&ptr,local_dc0,local_e4c);
    scale1.m_backend.data._M_elems[0] = (fpclass_type)local_c98;
    scale1.m_backend.data._M_elems[1] = (uint)local_948;
    scale1.m_backend.data._M_elems[2] = (uint)((ulong)local_948 >> 0x20);
    scale1.m_backend.data._M_elems[3] = (uint)uStack_940;
    scale1.m_backend.data._M_elems[4] = (uint)((ulong)uStack_940 >> 0x20);
    scale1.m_backend.data._M_elems[5] = (uint)local_938;
    scale1.m_backend.data._M_elems[6] = (uint)((ulong)local_938 >> 0x20);
    scale1.m_backend.data._M_elems[7] = (uint)uStack_930;
    scale1.m_backend.data._M_elems[8] = (uint)((ulong)uStack_930 >> 0x20);
    scale1.m_backend.data._M_elems[9] = local_928;
    scale1.m_backend.exp = local_a38;
    scale1.m_backend.prec_elem = (int32_t)local_d70;
    scale1.m_backend.fpclass = local_e50;
    scale1.m_backend.neg = (bool)bVar55;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&scale1.m_backend,&obj_j.m_backend);
    result_2.m_backend.data._M_elems[1] =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    result_2.m_backend.data._M_elems[0] =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    result_2.m_backend.data._M_elems[3] =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    result_2.m_backend.data._M_elems[2] =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    result_2.m_backend.data._M_elems[5] = local_e88._4_4_;
    result_2.m_backend.data._M_elems[4] = local_e88._0_4_;
    result_2.m_backend.data._M_elems._24_5_ = SUB85(CONCAT44(local_e88._12_4_,local_e88._8_4_),0);
    result_2.m_backend.data._M_elems[7]._1_3_ = SUB43(local_e88._12_4_,1);
    result_2.m_backend.data._M_elems._32_5_ = SUB85(CONCAT44(local_e88._20_4_,local_e88._16_4_),0);
    result_2.m_backend.data._M_elems[9]._1_3_ = SUB43(local_e88._20_4_,1);
    result_2.m_backend.exp = local_e88._24_4_;
    result_2.m_backend.neg = local_e6c;
    result_2.m_backend._48_8_ = local_e68._M_pi;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              (&result_2.m_backend,&scale1.m_backend);
    (*(pSVar34->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x24])(pSVar34,(ulong)uVar69,&result_2.m_backend,0);
  }
  uVar23 = local_d68._48_8_;
  bVar54 = local_d68[0x2c];
  uVar32 = local_d68._40_4_;
  uVar22 = local_d68._32_8_;
  uVar21 = local_d68._24_8_;
  uVar20 = local_d68._16_8_;
  uVar13 = local_d68._8_8_;
  uVar11 = local_d68._0_8_;
  result_38.m_backend.data._M_elems[0] = local_df8._0_4_;
  result_38.m_backend.data._M_elems[1] = local_df8._4_4_;
  result_38.m_backend.data._M_elems[2] = local_df8._8_4_;
  result_38.m_backend.data._M_elems[3] = local_df8._12_4_;
  result_38.m_backend.data._M_elems[4] = local_df8._16_4_;
  result_38.m_backend.data._M_elems[5] = local_df8._20_4_;
  result_38.m_backend.data._M_elems[6] = local_df8._24_4_;
  result_38.m_backend.data._M_elems[7] = local_df8._28_4_;
  result_38.m_backend.data._M_elems[8] = local_df8._32_4_;
  result_38.m_backend.data._M_elems[9] = local_df8._36_4_;
  result_38.m_backend.exp = local_df8._40_4_;
  result_38.m_backend.neg = local_df8[0x2c];
  result_38.m_backend.fpclass = local_df8._48_4_;
  result_38.m_backend.prec_elem = local_df8._52_4_;
  local_c98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d68._48_8_;
  uStack_c90 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&result_38.m_backend,&local_b88);
  local_e88._16_4_ = (undefined4)uVar22;
  local_e88._20_4_ = SUB84(uVar22,4);
  local_e88._0_4_ = (undefined4)uVar20;
  local_e88._4_4_ = SUB84(uVar20,4);
  local_e88._8_4_ = (undefined4)uVar21;
  local_e88._12_4_ = SUB84(uVar21,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)uVar11;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = SUB84(uVar11,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = (uint)uVar13;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = SUB84(uVar13,4);
  local_e88._24_4_ = uVar32;
  local_e6c = bVar54;
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23;
  if ((bVar54 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || (fpclass_type)local_c98 != cpp_dec_float_finite)) {
    local_e6c = false;
  }
  result_2.m_backend.data._M_elems._32_5_ = result_38.m_backend.data._M_elems._32_5_;
  result_2.m_backend.data._M_elems[9]._1_3_ = result_38.m_backend.data._M_elems[9]._1_3_;
  result_2.m_backend.data._M_elems[4] = result_38.m_backend.data._M_elems[4];
  result_2.m_backend.data._M_elems[5] = result_38.m_backend.data._M_elems[5];
  result_2.m_backend.data._M_elems._24_5_ = result_38.m_backend.data._M_elems._24_5_;
  result_2.m_backend.data._M_elems[7]._1_3_ = result_38.m_backend.data._M_elems[7]._1_3_;
  result_2.m_backend.data._M_elems[0] = result_38.m_backend.data._M_elems[0];
  result_2.m_backend.data._M_elems[1] = result_38.m_backend.data._M_elems[1];
  uVar11 = result_2.m_backend.data._M_elems._0_8_;
  result_2.m_backend.data._M_elems[2] = result_38.m_backend.data._M_elems[2];
  result_2.m_backend.data._M_elems[3] = result_38.m_backend.data._M_elems[3];
  result_2.m_backend.exp = result_38.m_backend.exp;
  result_2.m_backend.neg = result_38.m_backend.neg;
  result_2.m_backend.fpclass = result_38.m_backend.fpclass;
  result_2.m_backend.prec_elem = result_38.m_backend.prec_elem;
  fVar70 = result_38.m_backend.fpclass;
  if ((result_38.m_backend.neg == true) &&
     (result_2.m_backend.data._M_elems[0] = result_38.m_backend.data._M_elems[0],
     fVar70 != cpp_dec_float_finite || result_2.m_backend.data._M_elems[0] != 0)) {
    result_2.m_backend.neg = false;
  }
  piVar64 = (int32_t *)((long)&local_e68._M_pi + 4);
  result_2.m_backend.data._M_elems._0_8_ = uVar11;
  if (fVar70 == cpp_dec_float_NaN || (fpclass_type)local_c98 == cpp_dec_float_NaN) {
LAB_0031c2d6:
    piVar63 = &result_2.m_backend.prec_elem;
    scale1.m_backend.data._M_elems[8] = result_2.m_backend.data._M_elems[8];
    scale1.m_backend.data._M_elems[9] =
         (uint)(CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                         result_2.m_backend.data._M_elems._32_5_) >> 0x20);
    scale1.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
    scale1.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
    scale1.m_backend.data._M_elems[6] = result_2.m_backend.data._M_elems[6];
    scale1.m_backend.data._M_elems[7] =
         (uint)(CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                         result_2.m_backend.data._M_elems._24_5_) >> 0x20);
    scale1.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
    scale1.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
    scale1.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
    scale1.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
    scale1.m_backend.exp = result_2.m_backend.exp;
    scale1.m_backend.neg = result_2.m_backend.neg;
    scale1.m_backend.fpclass = fVar70;
  }
  else {
    iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_2.m_backend);
    if (iVar56 < 1) {
      fVar70 = result_2.m_backend.fpclass;
      goto LAB_0031c2d6;
    }
    scale1.m_backend.data._M_elems[8] = local_e88._16_4_;
    scale1.m_backend.data._M_elems[9] = local_e88._20_4_;
    scale1.m_backend.data._M_elems[4] = local_e88._0_4_;
    scale1.m_backend.data._M_elems[5] = local_e88._4_4_;
    scale1.m_backend.data._M_elems[6] = local_e88._8_4_;
    scale1.m_backend.data._M_elems[7] = local_e88._12_4_;
    scale1.m_backend.data._M_elems[0] =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    scale1.m_backend.data._M_elems[1] =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    scale1.m_backend.data._M_elems[2] =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    scale1.m_backend.data._M_elems[3] =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    scale1.m_backend.exp = local_e88._24_4_;
    scale1.m_backend.neg = local_e6c;
    scale1.m_backend.fpclass = (fpclass_type)local_e68._M_pi;
    piVar63 = piVar64;
  }
  uVar23 = local_d68._48_8_;
  bVar54 = local_d68[0x2c];
  uVar32 = local_d68._40_4_;
  uVar22 = local_d68._32_8_;
  uVar21 = local_d68._24_8_;
  uVar20 = local_d68._16_8_;
  uVar13 = local_d68._8_8_;
  uVar11 = local_d68._0_8_;
  scale1.m_backend.prec_elem = *piVar63;
  result_41.m_backend.data._M_elems[0] = local_df8._0_4_;
  result_41.m_backend.data._M_elems[1] = local_df8._4_4_;
  result_41.m_backend.data._M_elems[2] = local_df8._8_4_;
  result_41.m_backend.data._M_elems[3] = local_df8._12_4_;
  result_41.m_backend.data._M_elems[4] = local_df8._16_4_;
  result_41.m_backend.data._M_elems[5] = local_df8._20_4_;
  result_41.m_backend.data._M_elems[6] = local_df8._24_4_;
  result_41.m_backend.data._M_elems[7] = local_df8._28_4_;
  result_41.m_backend.data._M_elems[8] = local_df8._32_4_;
  result_41.m_backend.data._M_elems[9] = local_df8._36_4_;
  result_41.m_backend.exp = local_df8._40_4_;
  result_41.m_backend.neg = local_df8[0x2c];
  result_41.m_backend.fpclass = local_df8._48_4_;
  result_41.m_backend.prec_elem = local_df8._52_4_;
  local_c98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d68._48_8_;
  uStack_c90 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&result_41.m_backend,&local_b48);
  local_e88._16_4_ = (undefined4)uVar22;
  local_e88._20_4_ = SUB84(uVar22,4);
  local_e88._0_4_ = (undefined4)uVar20;
  local_e88._4_4_ = SUB84(uVar20,4);
  local_e88._8_4_ = (undefined4)uVar21;
  local_e88._12_4_ = SUB84(uVar21,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)uVar11;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = SUB84(uVar11,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = (uint)uVar13;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = SUB84(uVar13,4);
  local_e88._24_4_ = uVar32;
  local_e6c = bVar54;
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23;
  if ((bVar54 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || (fpclass_type)local_c98 != cpp_dec_float_finite)) {
    local_e6c = false;
  }
  result_2.m_backend.data._M_elems._32_5_ = result_41.m_backend.data._M_elems._32_5_;
  result_2.m_backend.data._M_elems[9]._1_3_ = result_41.m_backend.data._M_elems[9]._1_3_;
  result_2.m_backend.data._M_elems[4] = result_41.m_backend.data._M_elems[4];
  result_2.m_backend.data._M_elems[5] = result_41.m_backend.data._M_elems[5];
  result_2.m_backend.data._M_elems._24_5_ = result_41.m_backend.data._M_elems._24_5_;
  result_2.m_backend.data._M_elems[7]._1_3_ = result_41.m_backend.data._M_elems[7]._1_3_;
  result_2.m_backend.data._M_elems[0] = result_41.m_backend.data._M_elems[0];
  result_2.m_backend.data._M_elems[1] = result_41.m_backend.data._M_elems[1];
  uVar11 = result_2.m_backend.data._M_elems._0_8_;
  result_2.m_backend.data._M_elems[2] = result_41.m_backend.data._M_elems[2];
  result_2.m_backend.data._M_elems[3] = result_41.m_backend.data._M_elems[3];
  result_2.m_backend.exp = result_41.m_backend.exp;
  result_2.m_backend.neg = result_41.m_backend.neg;
  result_2.m_backend.fpclass = result_41.m_backend.fpclass;
  result_2.m_backend.prec_elem = result_41.m_backend.prec_elem;
  fVar70 = result_41.m_backend.fpclass;
  if ((result_41.m_backend.neg == true) &&
     (result_2.m_backend.data._M_elems[0] = result_41.m_backend.data._M_elems[0],
     fVar70 != cpp_dec_float_finite || result_2.m_backend.data._M_elems[0] != 0)) {
    result_2.m_backend.neg = false;
  }
  result_2.m_backend.data._M_elems._0_8_ = uVar11;
  if (fVar70 == cpp_dec_float_NaN || (fpclass_type)local_c98 == cpp_dec_float_NaN) {
LAB_0031c53a:
    piVar64 = &result_2.m_backend.prec_elem;
    scale2.m_backend.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
    scale2.m_backend.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
    scale2.m_backend.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
    scale2.m_backend.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
    scale2.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
    scale2.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
    scale2.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
    scale2.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
    scale2.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
    scale2.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
    scale2.m_backend.exp = result_2.m_backend.exp;
    scale2.m_backend.neg = result_2.m_backend.neg;
    scale2.m_backend.fpclass = fVar70;
  }
  else {
    iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_2.m_backend);
    if (iVar56 < 1) {
      fVar70 = result_2.m_backend.fpclass;
      goto LAB_0031c53a;
    }
    scale2.m_backend.data._M_elems[9] = local_e88._20_4_;
    scale2.m_backend.data._M_elems[8] = local_e88._16_4_;
    scale2.m_backend.data._M_elems[1] =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    scale2.m_backend.data._M_elems[0] =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    scale2.m_backend.data._M_elems[3] =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    scale2.m_backend.data._M_elems[2] =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    scale2.m_backend.data._M_elems[5] = local_e88._4_4_;
    scale2.m_backend.data._M_elems[4] = local_e88._0_4_;
    scale2.m_backend.data._M_elems[7] = local_e88._12_4_;
    scale2.m_backend.data._M_elems[6] = local_e88._8_4_;
    scale2.m_backend.exp = local_e88._24_4_;
    scale2.m_backend.neg = local_e6c;
    scale2.m_backend.fpclass = (fpclass_type)local_e68._M_pi;
  }
  scale2.m_backend.prec_elem = *piVar64;
  if (scale1.m_backend.fpclass != cpp_dec_float_NaN) {
    local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e88._0_4_ = 0;
    local_e88._4_4_ = 0;
    local_e88._8_4_ = 0;
    local_e88._12_4_ = 0;
    local_e88._16_4_ = 0;
    local_e88._20_4_ = 0;
    local_e88._24_4_ = 0;
    local_e6c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,1.0);
    iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&scale1.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    if (iVar56 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&scale1,1.0);
    }
  }
  if (scale2.m_backend.fpclass != cpp_dec_float_NaN) {
    local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e88._0_4_ = 0;
    local_e88._4_4_ = 0;
    local_e88._8_4_ = 0;
    local_e88._12_4_ = 0;
    local_e88._16_4_ = 0;
    local_e88._20_4_ = 0;
    local_e88._24_4_ = 0;
    local_e6c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,1.0);
    iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&scale2.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    if (iVar56 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&scale2,1.0);
    }
  }
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  local_e88._0_4_ = 0;
  local_e88._4_4_ = 0;
  local_e88._8_4_ = 0;
  local_e88._12_4_ = 0;
  local_e88._16_4_ = 0;
  local_e88._20_4_ = 0;
  local_e88._24_4_ = 0;
  local_e6c = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)&ptr,(cpp_dec_float<50U,_int,_void> *)local_d68,
             &scale1.m_backend);
  result_45.m_backend.data._M_elems._32_5_ = SUB85(local_df8._32_8_,0);
  result_45.m_backend.data._M_elems[9]._1_3_ = SUB83(local_df8._32_8_,5);
  result_45.m_backend.data._M_elems[4] = local_df8._16_4_;
  result_45.m_backend.data._M_elems[5] = local_df8._20_4_;
  result_45.m_backend.data._M_elems._24_5_ = SUB85(local_df8._24_8_,0);
  result_45.m_backend.data._M_elems[7]._1_3_ = SUB83(local_df8._24_8_,5);
  result_45.m_backend.data._M_elems[0] = local_df8._0_4_;
  result_45.m_backend.data._M_elems[1] = local_df8._4_4_;
  result_45.m_backend.data._M_elems[2] = local_df8._8_4_;
  result_45.m_backend.data._M_elems[3] = local_df8._12_4_;
  result_45.m_backend.exp = local_df8._40_4_;
  result_45.m_backend.neg = local_df8[0x2c];
  result_45.m_backend.fpclass = local_df8._48_4_;
  result_45.m_backend.prec_elem = local_df8._52_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&result_45.m_backend,&local_b88);
  result_46.m_backend.fpclass = cpp_dec_float_finite;
  result_46.m_backend.prec_elem = 10;
  result_46.m_backend.data._M_elems[0] = 0;
  result_46.m_backend.data._M_elems[1] = 0;
  result_46.m_backend.data._M_elems[2] = 0;
  result_46.m_backend.data._M_elems[3] = 0;
  result_46.m_backend.data._M_elems[4] = 0;
  result_46.m_backend.data._M_elems[5] = 0;
  result_46.m_backend.data._M_elems._24_5_ = 0;
  result_46.m_backend.data._M_elems[7]._1_3_ = 0;
  result_46.m_backend.data._M_elems._32_5_ = 0;
  result_46.m_backend.data._M_elems[9]._1_3_ = 0;
  result_46.m_backend.exp = 0;
  result_46.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_46.m_backend,&result_45.m_backend,&scale1.m_backend);
  result_2.m_backend.data._M_elems._32_5_ = SUB85(CONCAT44(local_e88._20_4_,local_e88._16_4_),0);
  result_2.m_backend.data._M_elems[9]._1_3_ = SUB43(local_e88._20_4_,1);
  result_2.m_backend.data._M_elems[1] =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr._4_4_;
  result_2.m_backend.data._M_elems[0] =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  result_2.m_backend.data._M_elems[3] =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_4_;
  result_2.m_backend.data._M_elems[2] =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  result_2.m_backend.data._M_elems[5] = local_e88._4_4_;
  result_2.m_backend.data._M_elems[4] = local_e88._0_4_;
  result_2.m_backend.data._M_elems._24_5_ = SUB85(CONCAT44(local_e88._12_4_,local_e88._8_4_),0);
  result_2.m_backend.data._M_elems[7]._1_3_ = SUB43(local_e88._12_4_,1);
  result_2.m_backend.exp = local_e88._24_4_;
  result_2.m_backend.neg = local_e6c;
  result_2.m_backend._48_8_ = local_e68._M_pi;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            (&result_2.m_backend,&result_46.m_backend);
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  local_e88._0_4_ = 0;
  local_e88._4_4_ = 0;
  local_e88._8_4_ = 0;
  local_e88._12_4_ = 0;
  local_e88._16_4_ = 0;
  local_e88._20_4_ = 0;
  local_e88._24_4_ = 0;
  local_e6c = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)&ptr,(cpp_dec_float<50U,_int,_void> *)local_d68,
             &scale2.m_backend);
  result_49.m_backend.data._M_elems[8] = local_df8._32_4_;
  result_49.m_backend.data._M_elems[9] = local_df8._36_4_;
  result_49.m_backend.data._M_elems[4] = local_df8._16_4_;
  result_49.m_backend.data._M_elems[5] = local_df8._20_4_;
  result_49.m_backend.data._M_elems[6] = local_df8._24_4_;
  result_49.m_backend.data._M_elems[7] = local_df8._28_4_;
  result_49.m_backend.data._M_elems[0] = local_df8._0_4_;
  result_49.m_backend.data._M_elems[1] = local_df8._4_4_;
  result_49.m_backend.data._M_elems[2] = local_df8._8_4_;
  result_49.m_backend.data._M_elems[3] = local_df8._12_4_;
  result_49.m_backend.exp = local_df8._40_4_;
  result_49.m_backend.neg = local_df8[0x2c];
  result_49.m_backend.fpclass = local_df8._48_4_;
  result_49.m_backend.prec_elem = local_df8._52_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&result_49.m_backend,&local_b48);
  result_45.m_backend.fpclass = cpp_dec_float_finite;
  result_45.m_backend.prec_elem = 10;
  result_45.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result_45.m_backend.data._M_elems[4] = 0;
  result_45.m_backend.data._M_elems[5] = 0;
  result_45.m_backend.data._M_elems._24_5_ = 0;
  result_45.m_backend.data._M_elems[7]._1_3_ = 0;
  result_45.m_backend.data._M_elems._32_5_ = 0;
  result_45.m_backend.data._M_elems[9]._1_3_ = 0;
  result_45.m_backend.exp = 0;
  result_45.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_45.m_backend,&result_49.m_backend,&scale2.m_backend);
  result_46.m_backend.data._M_elems._32_5_ = SUB85(CONCAT44(local_e88._20_4_,local_e88._16_4_),0);
  result_46.m_backend.data._M_elems[9]._1_3_ = SUB43(local_e88._20_4_,1);
  result_46.m_backend.data._M_elems[1] =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr._4_4_;
  result_46.m_backend.data._M_elems[0] =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  result_46.m_backend.data._M_elems[3] =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_4_;
  result_46.m_backend.data._M_elems[2] =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  result_46.m_backend.data._M_elems[5] = local_e88._4_4_;
  result_46.m_backend.data._M_elems[4] = local_e88._0_4_;
  result_46.m_backend.data._M_elems._24_5_ = SUB85(CONCAT44(local_e88._12_4_,local_e88._8_4_),0);
  result_46.m_backend.data._M_elems[7]._1_3_ = SUB43(local_e88._12_4_,1);
  result_46.m_backend.exp = local_e88._24_4_;
  result_46.m_backend.neg = local_e6c;
  result_46.m_backend._48_8_ = local_e68._M_pi;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            (&result_46.m_backend,&result_45.m_backend);
  uVar23 = result_2.m_backend._48_8_;
  bVar54 = result_2.m_backend.neg;
  iVar56 = result_2.m_backend.exp;
  uVar27 = result_2.m_backend.data._M_elems._32_5_;
  uVar26 = result_2.m_backend.data._M_elems._24_5_;
  uVar22 = result_2.m_backend.data._M_elems._16_8_;
  uVar21 = result_2.m_backend.data._M_elems._8_8_;
  uVar20 = result_2.m_backend.data._M_elems._0_8_;
  uVar11 = CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                    result_2.m_backend.data._M_elems._24_5_);
  uVar13 = CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                    result_2.m_backend.data._M_elems._32_5_);
  local_c98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_2.m_backend._48_8_;
  uStack_c90 = 0;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_248,this);
  local_e88._16_4_ = (undefined4)uVar27;
  local_e88._20_4_ = (undefined4)((ulong)uVar13 >> 0x20);
  local_e88._0_4_ = (undefined4)uVar22;
  local_e88._4_4_ = SUB84(uVar22,4);
  local_e88._8_4_ = (undefined4)uVar26;
  local_e88._12_4_ = (undefined4)((ulong)uVar11 >> 0x20);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)uVar20;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = SUB84(uVar20,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = (uint)uVar21;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = SUB84(uVar21,4);
  local_e88._24_4_ = iVar56;
  local_e6c = bVar54;
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23;
  if ((bVar54 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || (fpclass_type)local_c98 != cpp_dec_float_finite)) {
    local_e6c = false;
  }
  if ((((fpclass_type)local_c98 != cpp_dec_float_NaN) && (local_248.fpclass != cpp_dec_float_NaN))
     && (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_248), iVar56 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,0.0);
  }
  uVar23 = result_46.m_backend._48_8_;
  bVar54 = result_46.m_backend.neg;
  iVar56 = result_46.m_backend.exp;
  uVar27 = result_46.m_backend.data._M_elems._32_5_;
  uVar26 = result_46.m_backend.data._M_elems._24_5_;
  uVar22 = result_46.m_backend.data._M_elems._16_8_;
  uVar21 = result_46.m_backend.data._M_elems._8_8_;
  uVar20 = result_46.m_backend.data._M_elems._0_8_;
  uVar13 = CONCAT35(result_46.m_backend.data._M_elems[9]._1_3_,
                    result_46.m_backend.data._M_elems._32_5_);
  uVar11 = CONCAT35(result_46.m_backend.data._M_elems[7]._1_3_,
                    result_46.m_backend.data._M_elems._24_5_);
  local_c98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_46.m_backend._48_8_;
  uStack_c90 = 0;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_280,this);
  local_e88._16_4_ = (undefined4)uVar27;
  local_e88._20_4_ = (undefined4)((ulong)uVar13 >> 0x20);
  local_e88._0_4_ = (undefined4)uVar22;
  local_e88._4_4_ = SUB84(uVar22,4);
  local_e88._8_4_ = (undefined4)uVar26;
  local_e88._12_4_ = (undefined4)((ulong)uVar11 >> 0x20);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)uVar20;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = SUB84(uVar20,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = (uint)uVar21;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = SUB84(uVar21,4);
  local_e88._24_4_ = iVar56;
  local_e6c = bVar54;
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23;
  if ((bVar54 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || (fpclass_type)local_c98 != cpp_dec_float_finite)) {
    local_e6c = false;
  }
  if ((((fpclass_type)local_c98 != cpp_dec_float_NaN) && (local_280.fpclass != cpp_dec_float_NaN))
     && (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_280), iVar56 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_46,0.0);
  }
  result_45.m_backend.data._M_elems._32_5_ = SUB85(local_da8._32_8_,0);
  result_45.m_backend.data._M_elems[9]._1_3_ = SUB83(local_da8._32_8_,5);
  result_45.m_backend.data._M_elems[4] = local_da8._16_4_;
  result_45.m_backend.data._M_elems[5] = local_da8._20_4_;
  result_45.m_backend.data._M_elems._24_5_ = SUB85(local_da8._24_8_,0);
  result_45.m_backend.data._M_elems[7]._1_3_ = SUB83(local_da8._24_8_,5);
  result_45.m_backend.data._M_elems[0] = local_da8._0_4_;
  result_45.m_backend.data._M_elems[1] = local_da8._4_4_;
  result_45.m_backend.data._M_elems[2] = local_da8._8_4_;
  result_45.m_backend.data._M_elems[3] = local_da8._12_4_;
  result_45.m_backend.exp = local_da8._40_4_;
  result_45.m_backend.neg = local_da8[0x2c];
  result_45.m_backend.fpclass = local_da8._48_4_;
  result_45.m_backend.prec_elem = local_da8._52_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&result_45.m_backend,(cpp_dec_float<50U,_int,_void> *)local_df8);
  if (result_45.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0031cb5e:
    result_45.m_backend.data._M_elems._32_5_ = SUB85(local_da8._32_8_,0);
    result_45.m_backend.data._M_elems[9]._1_3_ = SUB83(local_da8._32_8_,5);
    result_45.m_backend.data._M_elems[4] = local_da8._16_4_;
    result_45.m_backend.data._M_elems[5] = local_da8._20_4_;
    result_45.m_backend.data._M_elems._24_5_ = SUB85(local_da8._24_8_,0);
    result_45.m_backend.data._M_elems[7]._1_3_ = SUB83(local_da8._24_8_,5);
    result_45.m_backend.data._M_elems[2] = local_da8._8_4_;
    result_45.m_backend.data._M_elems[3] = local_da8._12_4_;
    result_45.m_backend.data._M_elems[0] = local_da8._0_4_;
    result_45.m_backend.data._M_elems[1] = local_da8._4_4_;
    result_45.m_backend.exp = local_da8._40_4_;
    result_45.m_backend.neg = local_da8[0x2c];
    result_45.m_backend.fpclass = local_da8._48_4_;
    result_45.m_backend.prec_elem = local_da8._52_4_;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result_45.m_backend,(cpp_dec_float<50U,_int,_void> *)local_df8);
    if (result_45.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0031d693:
      puVar59 = (undefined8 *)__cxa_allocate_exception(0x28);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_e88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ptr,"XMAISM12 This should never happen.","");
      *puVar59 = &PTR__SPxException_003adbd8;
      puVar59[1] = puVar59 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar59 + 1),
                 ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(long)&(ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_PostStep +
                         CONCAT44(ptr.
                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_,
                                  (uint)ptr.
                                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi));
      *puVar59 = &PTR__SPxException_003ae9a0;
      __cxa_throw(puVar59,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e88._0_4_ = 0;
    local_e88._4_4_ = 0;
    local_e88._8_4_ = 0;
    local_e88._12_4_ = 0;
    local_e88._16_4_ = 0;
    local_e88._20_4_ = 0;
    local_e88._24_4_ = 0;
    local_e6c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,0.0);
    iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&result_45.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    if (-1 < iVar56) goto LAB_0031d693;
    ::soplex::infinity::__tls_init();
    result_45.m_backend.fpclass = cpp_dec_float_finite;
    result_45.m_backend.prec_elem = 10;
    result_45.m_backend.data._M_elems[0] = 0;
    result_45.m_backend.data._M_elems[1] = 0;
    result_45.m_backend.data._M_elems[2] = 0;
    result_45.m_backend.data._M_elems[3] = 0;
    result_45.m_backend.data._M_elems[4] = 0;
    result_45.m_backend.data._M_elems[5] = 0;
    result_45.m_backend.data._M_elems._24_5_ = 0;
    result_45.m_backend.data._M_elems[7]._1_3_ = 0;
    result_45.m_backend.data._M_elems._32_5_ = 0;
    result_45.m_backend.data._M_elems[9]._1_3_ = 0;
    result_45.m_backend.exp = 0;
    result_45.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_45,local_db8);
    if (((local_b48.fpclass == cpp_dec_float_NaN) ||
        (result_45.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b48,&result_45.m_backend), 0 < iVar56)) {
      result_49.m_backend.data._M_elems[9]._1_3_ = result_46.m_backend.data._M_elems[9]._1_3_;
      result_49.m_backend.data._M_elems._32_5_ = result_46.m_backend.data._M_elems._32_5_;
      result_49.m_backend.data._M_elems[7]._1_3_ = result_46.m_backend.data._M_elems[7]._1_3_;
      result_49.m_backend.data._M_elems._24_5_ = result_46.m_backend.data._M_elems._24_5_;
      result_49.m_backend.data._M_elems[4] = result_46.m_backend.data._M_elems[4];
      result_49.m_backend.data._M_elems[5] = result_46.m_backend.data._M_elems[5];
      result_49.m_backend.data._M_elems[0] = result_46.m_backend.data._M_elems[0];
      result_49.m_backend.data._M_elems[1] = result_46.m_backend.data._M_elems[1];
      result_49.m_backend.data._M_elems[2] = result_46.m_backend.data._M_elems[2];
      result_49.m_backend.data._M_elems[3] = result_46.m_backend.data._M_elems[3];
      result_49.m_backend.exp = result_46.m_backend.exp;
      result_49.m_backend.neg = result_46.m_backend.neg;
      result_49.m_backend.fpclass = result_46.m_backend.fpclass;
      result_49.m_backend.prec_elem = result_46.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_49.m_backend,&scale2.m_backend);
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_49.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_da8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,local_db8);
    }
    local_c08._36_4_ = local_e88._20_4_;
    local_c08._32_4_ = local_e88._16_4_;
    local_c08._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_c08._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_c08._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_c08._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_c08._20_4_ = local_e88._4_4_;
    local_c08._16_4_ = local_e88._0_4_;
    local_c08._24_5_ = (undefined5)CONCAT44(local_e88._12_4_,local_e88._8_4_);
    local_c08._29_3_ = SUB43(local_e88._12_4_,1);
    local_c08._40_4_ = local_e88._24_4_;
    local_c08[0x2c] = local_e6c;
    local_bd8 = local_e68._M_pi;
    ::soplex::infinity::__tls_init();
    result_45.m_backend.fpclass = cpp_dec_float_finite;
    result_45.m_backend.prec_elem = 10;
    result_45.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems[4] = 0;
    result_45.m_backend.data._M_elems[5] = 0;
    result_45.m_backend.data._M_elems._24_5_ = 0;
    result_45.m_backend.data._M_elems[7]._1_3_ = 0;
    result_45.m_backend.data._M_elems._32_5_ = 0;
    result_45.m_backend.data._M_elems[9]._1_3_ = 0;
    result_45.m_backend.exp = 0;
    result_45.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_45,(double)local_d28._0_8_);
    if (((local_b88.fpclass == cpp_dec_float_NaN) ||
        (result_45.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b88,&result_45.m_backend), iVar56 < 0)) {
      result_49.m_backend.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
      result_49.m_backend.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
      result_49.m_backend.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
      result_49.m_backend.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
      result_49.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
      result_49.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
      result_49.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
      result_49.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
      result_49.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
      result_49.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
      result_49.m_backend.exp = result_2.m_backend.exp;
      result_49.m_backend.neg = result_2.m_backend.neg;
      result_49.m_backend.fpclass = result_2.m_backend.fpclass;
      result_49.m_backend.prec_elem = result_2.m_backend.prec_elem;
      pcVar67 = &scale1.m_backend;
      goto LAB_0031cf87;
    }
  }
  else {
    local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e88._0_4_ = 0;
    local_e88._4_4_ = 0;
    local_e88._8_4_ = 0;
    local_e88._12_4_ = 0;
    local_e88._16_4_ = 0;
    local_e88._20_4_ = 0;
    local_e88._24_4_ = 0;
    local_e6c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,0.0);
    iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&result_45.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    if (iVar56 < 1) goto LAB_0031cb5e;
    ::soplex::infinity::__tls_init();
    result_45.m_backend.fpclass = cpp_dec_float_finite;
    result_45.m_backend.prec_elem = 10;
    result_45.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems[4] = 0;
    result_45.m_backend.data._M_elems[5] = 0;
    result_45.m_backend.data._M_elems._24_5_ = 0;
    result_45.m_backend.data._M_elems[7]._1_3_ = 0;
    result_45.m_backend.data._M_elems._32_5_ = 0;
    result_45.m_backend.data._M_elems[9]._1_3_ = 0;
    result_45.m_backend.exp = 0;
    result_45.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_45,(double)local_d28._0_8_);
    if (((local_b88.fpclass == cpp_dec_float_NaN) ||
        (result_45.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b88,&result_45.m_backend), iVar56 < 0)) {
      result_49.m_backend.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
      result_49.m_backend.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
      result_49.m_backend.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
      result_49.m_backend.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
      result_49.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
      result_49.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
      result_49.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
      result_49.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
      result_49.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
      result_49.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
      result_49.m_backend.exp = result_2.m_backend.exp;
      result_49.m_backend.neg = result_2.m_backend.neg;
      result_49.m_backend.fpclass = result_2.m_backend.fpclass;
      result_49.m_backend.prec_elem = result_2.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_49.m_backend,&scale1.m_backend);
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_49.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_da8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,local_db8);
    }
    local_c08._36_4_ = local_e88._20_4_;
    local_c08._32_4_ = local_e88._16_4_;
    local_c08._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_c08._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_c08._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_c08._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_c08._20_4_ = local_e88._4_4_;
    local_c08._16_4_ = local_e88._0_4_;
    local_c08._24_5_ = (undefined5)CONCAT44(local_e88._12_4_,local_e88._8_4_);
    local_c08._29_3_ = SUB43(local_e88._12_4_,1);
    local_c08._40_4_ = local_e88._24_4_;
    local_c08[0x2c] = local_e6c;
    local_bd8 = local_e68._M_pi;
    ::soplex::infinity::__tls_init();
    result_45.m_backend.fpclass = cpp_dec_float_finite;
    result_45.m_backend.prec_elem = 10;
    result_45.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems[4] = 0;
    result_45.m_backend.data._M_elems[5] = 0;
    result_45.m_backend.data._M_elems._24_5_ = 0;
    result_45.m_backend.data._M_elems[7]._1_3_ = 0;
    result_45.m_backend.data._M_elems._32_5_ = 0;
    result_45.m_backend.data._M_elems[9]._1_3_ = 0;
    result_45.m_backend.exp = 0;
    result_45.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_45,local_db8);
    if (((local_b48.fpclass == cpp_dec_float_NaN) ||
        (result_45.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b48,&result_45.m_backend), 0 < iVar56)) {
      result_49.m_backend.data._M_elems[9]._1_3_ = result_46.m_backend.data._M_elems[9]._1_3_;
      result_49.m_backend.data._M_elems._32_5_ = result_46.m_backend.data._M_elems._32_5_;
      result_49.m_backend.data._M_elems[7]._1_3_ = result_46.m_backend.data._M_elems[7]._1_3_;
      result_49.m_backend.data._M_elems._24_5_ = result_46.m_backend.data._M_elems._24_5_;
      result_49.m_backend.data._M_elems[4] = result_46.m_backend.data._M_elems[4];
      result_49.m_backend.data._M_elems[5] = result_46.m_backend.data._M_elems[5];
      result_49.m_backend.data._M_elems[0] = result_46.m_backend.data._M_elems[0];
      result_49.m_backend.data._M_elems[1] = result_46.m_backend.data._M_elems[1];
      result_49.m_backend.data._M_elems[2] = result_46.m_backend.data._M_elems[2];
      result_49.m_backend.data._M_elems[3] = result_46.m_backend.data._M_elems[3];
      result_49.m_backend.exp = result_46.m_backend.exp;
      result_49.m_backend.neg = result_46.m_backend.neg;
      result_49.m_backend.fpclass = result_46.m_backend.fpclass;
      result_49.m_backend.prec_elem = result_46.m_backend.prec_elem;
      pcVar67 = &scale2.m_backend;
LAB_0031cf87:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_49.m_backend,pcVar67);
      local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e88._0_4_ = 0;
      local_e88._4_4_ = 0;
      local_e88._8_4_ = 0;
      local_e88._12_4_ = 0;
      local_e88._16_4_ = 0;
      local_e88._20_4_ = 0;
      local_e88._24_4_ = 0;
      local_e6c = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_49.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_da8);
      goto LAB_0031d023;
    }
  }
  ::soplex::infinity::__tls_init();
  local_e68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  local_e88._0_4_ = 0;
  local_e88._4_4_ = 0;
  local_e88._8_4_ = 0;
  local_e88._12_4_ = 0;
  local_e88._16_4_ = 0;
  local_e88._20_4_ = 0;
  local_e88._24_4_ = 0;
  local_e6c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&ptr,(double)local_d28._0_8_);
LAB_0031d023:
  p_Var15 = local_bd8;
  bVar54 = local_c08[0x2c];
  uVar32 = local_c08._40_4_;
  uVar20 = local_c08._32_8_;
  uVar26 = local_c08._24_5_;
  uVar13 = local_c08._16_8_;
  auVar24 = local_c08._0_16_;
  local_c48._36_4_ = local_e88._20_4_;
  local_c48._32_4_ = local_e88._16_4_;
  local_c48._4_4_ =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr._4_4_;
  local_c48._0_4_ =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_c48._12_4_ =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_4_;
  local_c48._8_4_ =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  local_c48._20_4_ = local_e88._4_4_;
  local_c48._16_4_ = local_e88._0_4_;
  local_c48._24_5_ = (undefined5)CONCAT44(local_e88._12_4_,local_e88._8_4_);
  local_c48._29_3_ = SUB43(local_e88._12_4_,1);
  local_c48._40_4_ = local_e88._24_4_;
  local_c48[0x2c] = local_e6c;
  local_c18 = local_e68._M_pi;
  result_45.m_backend.data._M_elems._32_5_ = local_cd8.data._M_elems._32_5_;
  result_45.m_backend.data._M_elems[9]._1_3_ = local_cd8.data._M_elems[9]._1_3_;
  result_45.m_backend.data._M_elems[4] = local_cd8.data._M_elems[4];
  result_45.m_backend.data._M_elems[5] = local_cd8.data._M_elems[5];
  result_45.m_backend.data._M_elems._24_5_ = local_cd8.data._M_elems._24_5_;
  result_45.m_backend.data._M_elems[7]._1_3_ = local_cd8.data._M_elems[7]._1_3_;
  result_45.m_backend.data._M_elems[2] = local_cd8.data._M_elems[2];
  result_45.m_backend.data._M_elems[3] = local_cd8.data._M_elems[3];
  result_45.m_backend.data._M_elems[0] = local_cd8.data._M_elems[0];
  result_45.m_backend.data._M_elems[1] = local_cd8.data._M_elems[1];
  fVar70 = local_cd8.fpclass;
  result_49.m_backend.data._M_elems[8] = local_d18.data._M_elems[8];
  result_49.m_backend.data._M_elems[9] = local_d18.data._M_elems[9];
  result_49.m_backend.data._M_elems[4] = local_d18.data._M_elems[4];
  result_49.m_backend.data._M_elems[5] = local_d18.data._M_elems[5];
  result_49.m_backend.data._M_elems[6] = local_d18.data._M_elems[6];
  result_49.m_backend.data._M_elems[7] = local_d18.data._M_elems[7];
  result_49.m_backend.data._M_elems[0] = local_d18.data._M_elems[0];
  result_49.m_backend.data._M_elems[1] = local_d18.data._M_elems[1];
  result_49.m_backend.data._M_elems[2] = local_d18.data._M_elems[2];
  result_49.m_backend.data._M_elems[3] = local_d18.data._M_elems[3];
  local_e50 = local_d18.exp;
  local_d70 = CONCAT71(local_d70._1_7_,local_d18.neg);
  local_a38 = local_d18.fpclass;
  iStack_a34 = local_d18.prec_elem;
  uStack_a30 = 0;
  uVar11 = CONCAT35(local_c08._29_3_,local_c08._24_5_);
  local_e8.data._M_elems[8] = local_cd8.data._M_elems[8];
  local_e8.data._M_elems[9] = local_cd8.data._M_elems[9];
  local_e8.data._M_elems[4] = local_cd8.data._M_elems[4];
  local_e8.data._M_elems[5] = local_cd8.data._M_elems[5];
  local_e8.data._M_elems[6] = local_cd8.data._M_elems[6];
  local_e8.data._M_elems[7] = local_cd8.data._M_elems[7];
  local_e8.data._M_elems[0] = local_cd8.data._M_elems[0];
  local_e8.data._M_elems[1] = local_cd8.data._M_elems[1];
  local_e8.data._M_elems[2] = local_cd8.data._M_elems[2];
  local_e8.data._M_elems[3] = local_cd8.data._M_elems[3];
  local_db8 = (double)CONCAT44(local_db8._4_4_,local_cd8.exp);
  local_e8.exp = local_cd8.exp;
  local_d28[0] = local_cd8.neg;
  local_e8.neg = local_cd8.neg;
  local_e8.fpclass = local_cd8.fpclass;
  local_c98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_c98._4_4_,local_cd8.prec_elem);
  local_e8.prec_elem = local_cd8.prec_elem;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_2b8,this);
  local_e88._16_4_ = (undefined4)uVar20;
  local_e88._20_4_ = SUB84(uVar20,4);
  local_e88._0_4_ = (undefined4)uVar13;
  local_e88._4_4_ = SUB84(uVar13,4);
  local_e88._8_4_ = (undefined4)uVar26;
  local_e88._12_4_ = (undefined4)((ulong)uVar11 >> 0x20);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = auVar24._0_4_;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = auVar24._4_4_;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = auVar24._8_4_;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = auVar24._12_4_;
  local_e88._24_4_ = uVar32;
  local_e6c = bVar54;
  local_e68._M_pi = p_Var15;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_e8);
  if ((((fpclass_type)local_e68._M_pi != cpp_dec_float_NaN) &&
      (local_2b8.fpclass != cpp_dec_float_NaN)) &&
     (iVar56 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_2b8), 0 < iVar56)) {
    (*(local_dc0->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(local_dc0,(ulong)local_e4c,local_c08,0);
    piVar19 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgBnds;
    *piVar19 = *piVar19 + 1;
  }
  local_128._32_8_ = local_c48._32_8_;
  local_128._29_3_ = local_c48._29_3_;
  local_128._24_5_ = local_c48._24_5_;
  local_128._16_8_ = local_c48._16_8_;
  local_128._0_8_ = local_c48._0_8_;
  local_128._8_8_ = local_c48._8_8_;
  local_128._40_4_ = local_c48._40_4_;
  local_128[0x2c] = local_c48[0x2c];
  local_128._48_8_ = local_c18;
  local_168.m_backend.data._M_elems[0] = local_d18.data._M_elems[0];
  local_168.m_backend.data._M_elems[1] = local_d18.data._M_elems[1];
  local_168.m_backend.data._M_elems[2] = local_d18.data._M_elems[2];
  local_168.m_backend.data._M_elems[3] = local_d18.data._M_elems[3];
  local_168.m_backend.data._M_elems[4] = local_d18.data._M_elems[4];
  local_168.m_backend.data._M_elems[5] = local_d18.data._M_elems[5];
  local_168.m_backend.data._M_elems[6] = local_d18.data._M_elems[6];
  local_168.m_backend.data._M_elems[7] = local_d18.data._M_elems[7];
  local_168.m_backend.data._M_elems[8] = local_d18.data._M_elems[8];
  local_168.m_backend.data._M_elems[9] = local_d18.data._M_elems[9];
  local_168.m_backend.exp = local_d18.exp;
  local_168.m_backend.neg = local_d18.neg;
  local_168.m_backend.fpclass = local_d18.fpclass;
  local_168.m_backend.prec_elem = local_d18.prec_elem;
  epsZero(&local_68,this);
  bVar54 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_128,&local_168,&local_68);
  pSVar34 = local_dc0;
  if (bVar54) {
    (*(local_dc0->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(local_dc0,(ulong)local_e4c,local_c48,0);
    piVar19 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgBnds;
    *piVar19 = *piVar19 + 1;
  }
  this_00 = (AggregationPS *)operator_new(0x1c8);
  auVar24 = (undefined1  [16])result_45.m_backend.data._M_elems._0_16_;
  iVar56 = *i;
  local_678._0_8_ = local_d68._0_8_;
  local_678._8_8_ = local_d68._8_8_;
  local_678._16_8_ = local_d68._16_8_;
  local_678._24_8_ = local_d68._24_8_;
  local_678._32_8_ = local_d68._32_8_;
  local_678._40_4_ = local_d68._40_4_;
  local_678[0x2c] = local_d68[0x2c];
  local_678._48_8_ = local_d68._48_8_;
  local_6b8.m_backend.data._M_elems[8] = result_49.m_backend.data._M_elems[8];
  local_6b8.m_backend.data._M_elems[9] = result_49.m_backend.data._M_elems[9];
  local_6b8.m_backend.data._M_elems[4] = result_49.m_backend.data._M_elems[4];
  local_6b8.m_backend.data._M_elems[5] = result_49.m_backend.data._M_elems[5];
  local_6b8.m_backend.data._M_elems[6] = result_49.m_backend.data._M_elems[6];
  local_6b8.m_backend.data._M_elems[7] = result_49.m_backend.data._M_elems[7];
  local_6b8.m_backend.data._M_elems[0] = result_49.m_backend.data._M_elems[0];
  local_6b8.m_backend.data._M_elems[1] = result_49.m_backend.data._M_elems[1];
  local_6b8.m_backend.data._M_elems[2] = result_49.m_backend.data._M_elems[2];
  local_6b8.m_backend.data._M_elems[3] = result_49.m_backend.data._M_elems[3];
  local_6b8.m_backend.exp = local_e50;
  local_6b8.m_backend.neg = (bool)(undefined1)local_d70;
  local_6b8.m_backend.fpclass = local_a38;
  local_6b8.m_backend.prec_elem = iStack_a34;
  local_6f8.m_backend.data._M_elems[7]._1_3_ = result_45.m_backend.data._M_elems[7]._1_3_;
  local_6f8.m_backend.data._M_elems._24_5_ = result_45.m_backend.data._M_elems._24_5_;
  local_6f8.m_backend.data._M_elems[0] = result_45.m_backend.data._M_elems[0];
  local_6f8.m_backend.data._M_elems[1] = result_45.m_backend.data._M_elems[1];
  local_6f8.m_backend.data._M_elems[2] = result_45.m_backend.data._M_elems[2];
  local_6f8.m_backend.data._M_elems[3] = result_45.m_backend.data._M_elems[3];
  local_6f8.m_backend.data._M_elems[4] = result_45.m_backend.data._M_elems[4];
  local_6f8.m_backend.data._M_elems[5] = result_45.m_backend.data._M_elems[5];
  local_6f8.m_backend.data._M_elems[9]._1_3_ = result_45.m_backend.data._M_elems[9]._1_3_;
  local_6f8.m_backend.data._M_elems._32_5_ = result_45.m_backend.data._M_elems._32_5_;
  local_6f8.m_backend.exp = local_db8._0_4_;
  local_6f8.m_backend.neg = (bool)local_d28[0];
  local_6f8.m_backend.fpclass = fVar70;
  local_6f8.m_backend.prec_elem = (fpclass_type)local_c98;
  local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  result_45.m_backend.data._M_elems._0_16_ = auVar24;
  AggregationPS::AggregationPS
            (this_00,pSVar34,iVar56,local_e54,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_678,&local_6b8,&local_6f8,&local_968);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)this_00;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = (uint)((ulong)this_00 >> 0x20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::AggregationPS*>
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  if (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_968.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  piVar19 = (this->m_rIdx).data;
  piVar19[*i] = piVar19[(long)(pSVar34->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum + -1];
  (*(pSVar34->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0xf])(pSVar34);
  piVar19 = (this->m_cIdx).data;
  piVar19[local_ce0] =
       piVar19[(long)(pSVar34->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum + -1];
  (*(pSVar34->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x15])(pSVar34,(ulong)local_e54);
  uVar2 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remRows;
  uVar3 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remCols;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remRows = uVar2 + 1;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remCols = uVar3 + 1;
  piVar19 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_remNzos;
  *piVar19 = *piVar19 + 2;
  piVar19 = (this->m_stat).data + 0xf;
  *piVar19 = *piVar19 + 1;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi._4_4_,
               (uint)ptr.
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._4_4_,
                        (uint)ptr.
                              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi));
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::aggregateVars(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 2);
   assert(EQrel(lp.lhs(i), lp.rhs(i), feastol()));

   R rhs = lp.rhs(i);
   assert(rhs < R(infinity) && rhs > R(-infinity));

   int j = row.index(0);
   int k = row.index(1);
   R aij = row.value(0);
   R aik = row.value(1);
   R lower_j = lp.lower(j);
   R upper_j = lp.upper(j);
   R lower_k = lp.lower(k);
   R upper_k = lp.upper(k);

   // fixed variables should be removed by simplifyCols()
   if(EQrel(lower_j, upper_j, feastol()) || EQrel(lower_k, upper_k, feastol()))
      return this->OKAY;

   assert(isNotZero(aij, this->epsZero()) && isNotZero(aik, this->epsZero()));

   SPxOut::debug(this, "IMAISM23 row {}: doubleton equation -> {} x_{} + {} x_{} = {}", i, aij, j, aik,
                 k, rhs);

   // determine which variable can be aggregated without requiring bound tightening of the other variable
   R new_lo_j;
   R new_up_j;
   R new_lo_k;
   R new_up_k;

   if(aij * aik < 0.0)
   {
      // orientation persists
      new_lo_j = (upper_k >=  R(infinity)) ? R(-infinity) : (rhs - aik * upper_k) / aij;
      new_up_j = (lower_k <= R(-infinity)) ?  R(infinity) : (rhs - aik * lower_k) / aij;
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : (rhs - aij * upper_j) / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : (rhs - aij * lower_j) / aik;
   }
   else if(aij * aik > 0.0)
   {
      // orientation is reversed
      new_lo_j = (lower_k <= R(-infinity)) ? R(-infinity) : (rhs - aik * lower_k) / aij;
      new_up_j = (upper_k >=  R(infinity)) ?  R(infinity) : (rhs - aik * upper_k) / aij;
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : (rhs - aij * lower_j) / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : (rhs - aij * upper_j) / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   bool flip_jk = false;

   if(new_lo_j <= R(-infinity) && new_up_j >= R(infinity))
   {
      // no bound tightening on x_j when x_k is aggregated
      flip_jk = true;
   }
   else if(new_lo_k <= R(-infinity) && new_up_k >= R(infinity))
   {
      // no bound tightening on x_k when x_j is aggregated
      flip_jk = false;
   }
   else if(LE(new_lo_j, lower_j, this->tolerances()->epsilon())
           && GE(new_up_j, upper_j, this->tolerances()->epsilon()))
   {
      if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
            && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
      {
         // both variables' bounds are not affected by aggregation; choose the better aggregation coeff (aik/aij)
         if(spxAbs(aij) > spxAbs(aik))
            flip_jk = false;
         else
            flip_jk = true;
      }
      else
         flip_jk = false;
   }
   else if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
           && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
   {
      flip_jk = true;
   }
   else
   {
      if(spxAbs(aij) > spxAbs(aik))
         flip_jk = false;
      else
         flip_jk = true;
   }

   if(flip_jk)
   {
      int _j = j;
      R _aij = aij;
      R _lower_j = lower_j;
      R _upper_j = upper_j;
      j = k;
      k = _j;
      aij = aik;
      aik = _aij;
      lower_j = lower_k;
      lower_k = _lower_j;
      upper_j = upper_k;
      upper_k = _upper_j;
   }

   const SVectorBase<R>& col_j = lp.colVector(j);
   const SVectorBase<R>& col_k = lp.colVector(k);

   // aggregation coefficients (x_j = aggr_coef * x_k + aggr_const)
   R aggr_coef = - (aik / aij);
   R aggr_const = rhs / aij;

   SPxOut::debug(this, " removed, replacing x_{} with {} + {} * x_{}\n", j, aggr_const, aggr_coef, k);

   // replace all occurrences of x_j
   for(int r = 0; r < col_j.size(); ++r)
   {
      int row_r = col_j.index(r);
      R arj = col_j.value(r);

      // skip row i
      if(row_r == i)
         continue;

      // adapt sides of row r
      R lhs_r = lp.lhs(row_r);
      R rhs_r = lp.rhs(row_r);

      if(lhs_r > R(-infinity))
      {
         lp.changeLhs(row_r, lhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      if(rhs_r < R(infinity))
      {
         lp.changeRhs(row_r, rhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      R newcoef = aggr_coef * arj;
      int pos_rk = col_k.pos(row_r);

      // check whether x_k is also present in row r and get its coefficient
      if(pos_rk >= 0)
      {
         R ark = col_k.value(pos_rk);
         newcoef += ark;
         this->m_remNzos++;
      }

      // add new column k to row r or adapt the coefficient a_rk
      lp.changeElement(row_r, k, newcoef);
   }

   // adapt objective function
   R obj_j = lp.obj(j);

   if(isNotZero(obj_j, this->epsZero()))
   {
      this->addObjoffset(aggr_const * obj_j);
      R obj_k = lp.obj(k);
      lp.changeObj(k, obj_k + aggr_coef * obj_j);
   }

   // adapt bounds of x_k
   R scale1 = maxAbs(rhs, aij * upper_j);
   R scale2 = maxAbs(rhs, aij * lower_j);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (rhs / scale1) - (aij * upper_j / scale1);
   R z2 = (rhs / scale2) - (aij * lower_j / scale2);

   // just some rounding
   if(isZero(z1, this->epsZero()))
      z1 = 0.0;

   if(isZero(z2, this->epsZero()))
      z2 = 0.0;

   // determine which side has to be used for the bounds comparison below
   if(aik * aij > 0.0)
   {
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : z1 * scale1 / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : z2 * scale2 / aik;
   }
   else if(aik * aij < 0.0)
   {
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : z2 * scale2 / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : z1 * scale1 / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   // change bounds of x_k if the new ones are tighter
   R oldlower_k = lower_k;
   R oldupper_k = upper_k;

   if(GT(new_lo_k, lower_k, this->epsZero()))
   {
      lp.changeLower(k, new_lo_k);
      this->m_chgBnds++;
   }

   if(LT(new_up_k, upper_k, this->epsZero()))
   {
      lp.changeUpper(k, new_up_k);
      this->m_chgBnds++;
   }

   std::shared_ptr<PostStep> ptr(new AggregationPS(lp, i, j, rhs, oldupper_k, oldlower_k,
                                 this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);
   removeCol(lp, j);

   this->m_remRows++;
   this->m_remCols++;
   this->m_remNzos += 2;

   ++m_stat[AGGREGATION];

   return this->OKAY;
}